

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 uVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  byte bVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  uint uVar69;
  ulong uVar71;
  ulong uVar72;
  undefined4 uVar73;
  undefined8 in_R9;
  bool bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar109 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar110 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar166;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float t1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar221;
  float fVar232;
  float fVar233;
  vfloat4 b0;
  undefined1 auVar222 [16];
  float fVar234;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar236 [16];
  undefined1 auVar231 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  float fVar265;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar266;
  undefined1 auVar263 [32];
  float fVar267;
  undefined1 auVar264 [64];
  float fVar268;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar279;
  undefined1 auVar275 [32];
  undefined1 auVar276 [64];
  vfloat4 a0;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar286 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  vfloat4 a0_1;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar303;
  float fVar311;
  undefined1 auVar306 [16];
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar314;
  float in_register_0000151c;
  undefined1 auVar307 [32];
  float fVar315;
  undefined1 auVar308 [64];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  float fVar321;
  undefined1 auVar320 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float in_register_0000159c;
  undefined1 auVar326 [32];
  float fVar332;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float in_register_000015dc;
  undefined1 auVar331 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  ulong local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 auStack_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [32];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  ulong local_318;
  Primitive *local_310;
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  uint auStack_2c8 [4];
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2ac;
  undefined4 local_2a4;
  undefined4 local_2a0;
  uint local_29c;
  uint local_298;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float afStack_1d8 [8];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar70;
  undefined1 auVar230 [32];
  undefined1 auVar327 [32];
  
  PVar8 = prim[1];
  uVar67 = (ulong)(byte)PVar8;
  fVar137 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar83 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar105._0_4_ = fVar137 * auVar83._0_4_;
  auVar105._4_4_ = fVar137 * auVar83._4_4_;
  auVar105._8_4_ = fVar137 * auVar83._8_4_;
  auVar105._12_4_ = fVar137 * auVar83._12_4_;
  auVar222._0_4_ = fVar137 * (ray->dir).field_0.m128[0];
  auVar222._4_4_ = fVar137 * (ray->dir).field_0.m128[1];
  auVar222._8_4_ = fVar137 * (ray->dir).field_0.m128[2];
  auVar222._12_4_ = fVar137 * (ray->dir).field_0.m128[3];
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 10)));
  auVar94._16_16_ = auVar255;
  auVar94._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 10)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar158._16_16_ = auVar255;
  auVar158._0_16_ = auVar83;
  auVar14 = vcvtdq2ps_avx(auVar158);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 10)));
  auVar176._16_16_ = auVar255;
  auVar176._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar176);
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 10)));
  auVar177._16_16_ = auVar255;
  auVar177._0_16_ = auVar83;
  auVar16 = vcvtdq2ps_avx(auVar177);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xc + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xc + 10)));
  auVar195._16_16_ = auVar255;
  auVar195._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xd + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xd + 10)));
  auVar17 = vcvtdq2ps_avx(auVar195);
  auVar196._16_16_ = auVar255;
  auVar196._0_16_ = auVar83;
  auVar18 = vcvtdq2ps_avx(auVar196);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x12 + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x12 + 10)));
  auVar197._16_16_ = auVar255;
  auVar197._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x13 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar197);
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x13 + 10)));
  auVar272._16_16_ = auVar255;
  auVar272._0_16_ = auVar83;
  auVar20 = vcvtdq2ps_avx(auVar272);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x14 + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x14 + 10)));
  auVar291._16_16_ = auVar255;
  auVar291._0_16_ = auVar83;
  auVar21 = vcvtdq2ps_avx(auVar291);
  auVar83 = vshufps_avx(auVar222,auVar222,0);
  auVar255 = vshufps_avx(auVar222,auVar222,0x55);
  auVar156 = vshufps_avx(auVar222,auVar222,0xaa);
  fVar137 = auVar156._0_4_;
  fVar201 = auVar156._4_4_;
  fVar164 = auVar156._8_4_;
  fVar215 = auVar156._12_4_;
  fVar165 = auVar255._0_4_;
  fVar216 = auVar255._4_4_;
  fVar166 = auVar255._8_4_;
  fVar217 = auVar255._12_4_;
  fVar167 = auVar83._0_4_;
  fVar218 = auVar83._4_4_;
  fVar168 = auVar83._8_4_;
  fVar219 = auVar83._12_4_;
  auVar307._0_4_ = fVar167 * auVar94._0_4_ + fVar165 * auVar14._0_4_ + fVar137 * auVar15._0_4_;
  auVar307._4_4_ = fVar218 * auVar94._4_4_ + fVar216 * auVar14._4_4_ + fVar201 * auVar15._4_4_;
  auVar307._8_4_ = fVar168 * auVar94._8_4_ + fVar166 * auVar14._8_4_ + fVar164 * auVar15._8_4_;
  auVar307._12_4_ = fVar219 * auVar94._12_4_ + fVar217 * auVar14._12_4_ + fVar215 * auVar15._12_4_;
  auVar307._16_4_ = fVar167 * auVar94._16_4_ + fVar165 * auVar14._16_4_ + fVar137 * auVar15._16_4_;
  auVar307._20_4_ = fVar218 * auVar94._20_4_ + fVar216 * auVar14._20_4_ + fVar201 * auVar15._20_4_;
  auVar307._24_4_ = fVar168 * auVar94._24_4_ + fVar166 * auVar14._24_4_ + fVar164 * auVar15._24_4_;
  auVar307._28_4_ = fVar217 + in_register_000015dc + in_register_0000151c;
  auVar299._0_4_ = fVar167 * auVar16._0_4_ + fVar165 * auVar17._0_4_ + auVar18._0_4_ * fVar137;
  auVar299._4_4_ = fVar218 * auVar16._4_4_ + fVar216 * auVar17._4_4_ + auVar18._4_4_ * fVar201;
  auVar299._8_4_ = fVar168 * auVar16._8_4_ + fVar166 * auVar17._8_4_ + auVar18._8_4_ * fVar164;
  auVar299._12_4_ = fVar219 * auVar16._12_4_ + fVar217 * auVar17._12_4_ + auVar18._12_4_ * fVar215;
  auVar299._16_4_ = fVar167 * auVar16._16_4_ + fVar165 * auVar17._16_4_ + auVar18._16_4_ * fVar137;
  auVar299._20_4_ = fVar218 * auVar16._20_4_ + fVar216 * auVar17._20_4_ + auVar18._20_4_ * fVar201;
  auVar299._24_4_ = fVar168 * auVar16._24_4_ + fVar166 * auVar17._24_4_ + auVar18._24_4_ * fVar164;
  auVar299._28_4_ = fVar217 + in_register_000015dc + in_register_0000159c;
  auVar229._0_4_ = fVar167 * auVar19._0_4_ + fVar165 * auVar20._0_4_ + auVar21._0_4_ * fVar137;
  auVar229._4_4_ = fVar218 * auVar19._4_4_ + fVar216 * auVar20._4_4_ + auVar21._4_4_ * fVar201;
  auVar229._8_4_ = fVar168 * auVar19._8_4_ + fVar166 * auVar20._8_4_ + auVar21._8_4_ * fVar164;
  auVar229._12_4_ = fVar219 * auVar19._12_4_ + fVar217 * auVar20._12_4_ + auVar21._12_4_ * fVar215;
  auVar229._16_4_ = fVar167 * auVar19._16_4_ + fVar165 * auVar20._16_4_ + auVar21._16_4_ * fVar137;
  auVar229._20_4_ = fVar218 * auVar19._20_4_ + fVar216 * auVar20._20_4_ + auVar21._20_4_ * fVar201;
  auVar229._24_4_ = fVar168 * auVar19._24_4_ + fVar166 * auVar20._24_4_ + auVar21._24_4_ * fVar164;
  auVar229._28_4_ = fVar219 + fVar217 + fVar215;
  auVar83 = vshufps_avx(auVar105,auVar105,0);
  auVar255 = vshufps_avx(auVar105,auVar105,0x55);
  auVar156 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar137 = auVar156._0_4_;
  fVar201 = auVar156._4_4_;
  fVar164 = auVar156._8_4_;
  fVar215 = auVar156._12_4_;
  fVar167 = auVar255._0_4_;
  fVar218 = auVar255._4_4_;
  fVar168 = auVar255._8_4_;
  fVar219 = auVar255._12_4_;
  fVar165 = auVar83._0_4_;
  fVar216 = auVar83._4_4_;
  fVar166 = auVar83._8_4_;
  fVar217 = auVar83._12_4_;
  auVar129._0_4_ = fVar165 * auVar94._0_4_ + fVar167 * auVar14._0_4_ + fVar137 * auVar15._0_4_;
  auVar129._4_4_ = fVar216 * auVar94._4_4_ + fVar218 * auVar14._4_4_ + fVar201 * auVar15._4_4_;
  auVar129._8_4_ = fVar166 * auVar94._8_4_ + fVar168 * auVar14._8_4_ + fVar164 * auVar15._8_4_;
  auVar129._12_4_ = fVar217 * auVar94._12_4_ + fVar219 * auVar14._12_4_ + fVar215 * auVar15._12_4_;
  auVar129._16_4_ = fVar165 * auVar94._16_4_ + fVar167 * auVar14._16_4_ + fVar137 * auVar15._16_4_;
  auVar129._20_4_ = fVar216 * auVar94._20_4_ + fVar218 * auVar14._20_4_ + fVar201 * auVar15._20_4_;
  auVar129._24_4_ = fVar166 * auVar94._24_4_ + fVar168 * auVar14._24_4_ + fVar164 * auVar15._24_4_;
  auVar129._28_4_ = auVar94._28_4_ + auVar14._28_4_ + auVar15._28_4_;
  auVar178._0_4_ = fVar165 * auVar16._0_4_ + auVar18._0_4_ * fVar137 + fVar167 * auVar17._0_4_;
  auVar178._4_4_ = fVar216 * auVar16._4_4_ + auVar18._4_4_ * fVar201 + fVar218 * auVar17._4_4_;
  auVar178._8_4_ = fVar166 * auVar16._8_4_ + auVar18._8_4_ * fVar164 + fVar168 * auVar17._8_4_;
  auVar178._12_4_ = fVar217 * auVar16._12_4_ + auVar18._12_4_ * fVar215 + fVar219 * auVar17._12_4_;
  auVar178._16_4_ = fVar165 * auVar16._16_4_ + auVar18._16_4_ * fVar137 + fVar167 * auVar17._16_4_;
  auVar178._20_4_ = fVar216 * auVar16._20_4_ + auVar18._20_4_ * fVar201 + fVar218 * auVar17._20_4_;
  auVar178._24_4_ = fVar166 * auVar16._24_4_ + auVar18._24_4_ * fVar164 + fVar168 * auVar17._24_4_;
  auVar178._28_4_ = auVar94._28_4_ + auVar18._28_4_ + auVar15._28_4_;
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  auVar159._16_4_ = 0x219392ef;
  auVar159._20_4_ = 0x219392ef;
  auVar159._24_4_ = 0x219392ef;
  auVar159._28_4_ = 0x219392ef;
  auVar94 = vandps_avx(auVar307,auVar95);
  auVar94 = vcmpps_avx(auVar94,auVar159,1);
  auVar14 = vblendvps_avx(auVar307,auVar159,auVar94);
  auVar94 = vandps_avx(auVar299,auVar95);
  auVar94 = vcmpps_avx(auVar94,auVar159,1);
  auVar15 = vblendvps_avx(auVar299,auVar159,auVar94);
  auVar94 = vandps_avx(auVar229,auVar95);
  auVar94 = vcmpps_avx(auVar94,auVar159,1);
  auVar94 = vblendvps_avx(auVar229,auVar159,auVar94);
  auVar16 = vrcpps_avx(auVar14);
  auVar198._0_4_ = fVar165 * auVar19._0_4_ + fVar167 * auVar20._0_4_ + auVar21._0_4_ * fVar137;
  auVar198._4_4_ = fVar216 * auVar19._4_4_ + fVar218 * auVar20._4_4_ + auVar21._4_4_ * fVar201;
  auVar198._8_4_ = fVar166 * auVar19._8_4_ + fVar168 * auVar20._8_4_ + auVar21._8_4_ * fVar164;
  auVar198._12_4_ = fVar217 * auVar19._12_4_ + fVar219 * auVar20._12_4_ + auVar21._12_4_ * fVar215;
  auVar198._16_4_ = fVar165 * auVar19._16_4_ + fVar167 * auVar20._16_4_ + auVar21._16_4_ * fVar137;
  auVar198._20_4_ = fVar216 * auVar19._20_4_ + fVar218 * auVar20._20_4_ + auVar21._20_4_ * fVar201;
  auVar198._24_4_ = fVar166 * auVar19._24_4_ + fVar168 * auVar20._24_4_ + auVar21._24_4_ * fVar164;
  auVar198._28_4_ = auVar17._28_4_ + fVar215 + 1e-18;
  fVar137 = auVar16._0_4_;
  fVar164 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar164;
  auVar17._0_4_ = auVar14._0_4_ * fVar137;
  fVar165 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar165;
  fVar166 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar166;
  fVar167 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar167;
  fVar168 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar168;
  fVar169 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar169;
  auVar17._28_4_ = 0x219392ef;
  auVar273._8_4_ = 0x3f800000;
  auVar273._0_8_ = 0x3f8000003f800000;
  auVar273._12_4_ = 0x3f800000;
  auVar273._16_4_ = 0x3f800000;
  auVar273._20_4_ = 0x3f800000;
  auVar273._24_4_ = 0x3f800000;
  auVar273._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar273,auVar17);
  auVar14 = vrcpps_avx(auVar15);
  fVar137 = fVar137 + fVar137 * auVar17._0_4_;
  fVar164 = fVar164 + fVar164 * auVar17._4_4_;
  fVar165 = fVar165 + fVar165 * auVar17._8_4_;
  fVar166 = fVar166 + fVar166 * auVar17._12_4_;
  fVar167 = fVar167 + fVar167 * auVar17._16_4_;
  fVar168 = fVar168 + fVar168 * auVar17._20_4_;
  fVar169 = fVar169 + fVar169 * auVar17._24_4_;
  fVar201 = auVar14._0_4_;
  fVar215 = auVar14._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar215;
  auVar18._0_4_ = auVar15._0_4_ * fVar201;
  fVar216 = auVar14._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar216;
  fVar217 = auVar14._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar217;
  fVar218 = auVar14._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar218;
  fVar219 = auVar14._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar219;
  fVar220 = auVar14._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar220;
  auVar18._28_4_ = auVar16._28_4_;
  auVar15 = vsubps_avx(auVar273,auVar18);
  auVar14 = vrcpps_avx(auVar94);
  fVar201 = fVar201 + fVar201 * auVar15._0_4_;
  fVar215 = fVar215 + fVar215 * auVar15._4_4_;
  fVar216 = fVar216 + fVar216 * auVar15._8_4_;
  fVar217 = fVar217 + fVar217 * auVar15._12_4_;
  fVar218 = fVar218 + fVar218 * auVar15._16_4_;
  fVar219 = fVar219 + fVar219 * auVar15._20_4_;
  fVar220 = fVar220 + fVar220 * auVar15._24_4_;
  fVar221 = auVar14._0_4_;
  fVar232 = auVar14._4_4_;
  auVar15._4_4_ = fVar232 * auVar94._4_4_;
  auVar15._0_4_ = fVar221 * auVar94._0_4_;
  fVar233 = auVar14._8_4_;
  auVar15._8_4_ = fVar233 * auVar94._8_4_;
  fVar234 = auVar14._12_4_;
  auVar15._12_4_ = fVar234 * auVar94._12_4_;
  fVar235 = auVar14._16_4_;
  auVar15._16_4_ = fVar235 * auVar94._16_4_;
  fVar237 = auVar14._20_4_;
  auVar15._20_4_ = fVar237 * auVar94._20_4_;
  fVar238 = auVar14._24_4_;
  auVar15._24_4_ = fVar238 * auVar94._24_4_;
  auVar15._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(auVar273,auVar15);
  fVar221 = fVar221 + fVar221 * auVar94._0_4_;
  fVar232 = fVar232 + fVar232 * auVar94._4_4_;
  fVar233 = fVar233 + fVar233 * auVar94._8_4_;
  fVar234 = fVar234 + fVar234 * auVar94._12_4_;
  fVar235 = fVar235 + fVar235 * auVar94._16_4_;
  fVar237 = fVar237 + fVar237 * auVar94._20_4_;
  fVar238 = fVar238 + fVar238 * auVar94._24_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + uVar67 * 7 + 0xe);
  auVar255 = vpmovsxwd_avx(auVar255);
  auVar96._16_16_ = auVar255;
  auVar96._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar96);
  auVar94 = vsubps_avx(auVar94,auVar129);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar83 = vpmovsxwd_avx(auVar156);
  auVar75._0_4_ = fVar137 * auVar94._0_4_;
  auVar75._4_4_ = fVar164 * auVar94._4_4_;
  auVar75._8_4_ = fVar165 * auVar94._8_4_;
  auVar75._12_4_ = fVar166 * auVar94._12_4_;
  auVar16._16_4_ = fVar167 * auVar94._16_4_;
  auVar16._0_16_ = auVar75;
  auVar16._20_4_ = fVar168 * auVar94._20_4_;
  auVar16._24_4_ = fVar169 * auVar94._24_4_;
  auVar16._28_4_ = auVar94._28_4_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar67 * 9 + 0xe);
  auVar255 = vpmovsxwd_avx(auVar124);
  auVar246._16_16_ = auVar255;
  auVar246._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar246);
  auVar94 = vsubps_avx(auVar94,auVar129);
  auVar106._0_4_ = fVar137 * auVar94._0_4_;
  auVar106._4_4_ = fVar164 * auVar94._4_4_;
  auVar106._8_4_ = fVar165 * auVar94._8_4_;
  auVar106._12_4_ = fVar166 * auVar94._12_4_;
  auVar19._16_4_ = fVar167 * auVar94._16_4_;
  auVar19._0_16_ = auVar106;
  auVar19._20_4_ = fVar168 * auVar94._20_4_;
  auVar19._24_4_ = fVar169 * auVar94._24_4_;
  auVar19._28_4_ = auVar94._28_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar67 * 0xe + 6);
  auVar83 = vpmovsxwd_avx(auVar112);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar67 * 0xe + 0xe);
  auVar255 = vpmovsxwd_avx(auVar142);
  auVar160._16_16_ = auVar255;
  auVar160._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar160);
  auVar94 = vsubps_avx(auVar94,auVar178);
  auVar138._0_4_ = fVar201 * auVar94._0_4_;
  auVar138._4_4_ = fVar215 * auVar94._4_4_;
  auVar138._8_4_ = fVar216 * auVar94._8_4_;
  auVar138._12_4_ = fVar217 * auVar94._12_4_;
  auVar20._16_4_ = fVar218 * auVar94._16_4_;
  auVar20._0_16_ = auVar138;
  auVar20._20_4_ = fVar219 * auVar94._20_4_;
  auVar20._24_4_ = fVar220 * auVar94._24_4_;
  auVar20._28_4_ = auVar94._28_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar113);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 0xe);
  auVar255 = vpmovsxwd_avx(auVar236);
  auVar247._16_16_ = auVar255;
  auVar247._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar247);
  auVar94 = vsubps_avx(auVar94,auVar178);
  auVar170._0_4_ = fVar201 * auVar94._0_4_;
  auVar170._4_4_ = fVar215 * auVar94._4_4_;
  auVar170._8_4_ = fVar216 * auVar94._8_4_;
  auVar170._12_4_ = fVar217 * auVar94._12_4_;
  auVar21._16_4_ = fVar218 * auVar94._16_4_;
  auVar21._0_16_ = auVar170;
  auVar21._20_4_ = fVar219 * auVar94._20_4_;
  auVar21._24_4_ = fVar220 * auVar94._24_4_;
  auVar21._28_4_ = auVar94._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar67 * 0x15 + 6);
  auVar83 = vpmovsxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar67 * 0x15 + 0xe);
  auVar255 = vpmovsxwd_avx(auVar6);
  auVar212._16_16_ = auVar255;
  auVar212._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar212);
  auVar94 = vsubps_avx(auVar94,auVar198);
  auVar202._0_4_ = fVar221 * auVar94._0_4_;
  auVar202._4_4_ = fVar232 * auVar94._4_4_;
  auVar202._8_4_ = fVar233 * auVar94._8_4_;
  auVar202._12_4_ = fVar234 * auVar94._12_4_;
  auVar22._16_4_ = fVar235 * auVar94._16_4_;
  auVar22._0_16_ = auVar202;
  auVar22._20_4_ = fVar237 * auVar94._20_4_;
  auVar22._24_4_ = fVar238 * auVar94._24_4_;
  auVar22._28_4_ = auVar94._28_4_;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar83 = vpmovsxwd_avx(auVar256);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 0xe);
  auVar255 = vpmovsxwd_avx(auVar7);
  auVar248._16_16_ = auVar255;
  auVar248._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar248);
  auVar94 = vsubps_avx(auVar94,auVar198);
  auVar180._0_4_ = fVar221 * auVar94._0_4_;
  auVar180._4_4_ = fVar232 * auVar94._4_4_;
  auVar180._8_4_ = fVar233 * auVar94._8_4_;
  auVar180._12_4_ = fVar234 * auVar94._12_4_;
  auVar23._16_4_ = fVar235 * auVar94._16_4_;
  auVar23._0_16_ = auVar180;
  auVar23._20_4_ = fVar237 * auVar94._20_4_;
  auVar23._24_4_ = fVar238 * auVar94._24_4_;
  auVar23._28_4_ = auVar94._28_4_;
  auVar83 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar255 = vpminsd_avx(auVar75,auVar106);
  auVar292._16_16_ = auVar83;
  auVar292._0_16_ = auVar255;
  auVar83 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar255 = vpminsd_avx(auVar138,auVar170);
  auVar300._16_16_ = auVar83;
  auVar300._0_16_ = auVar255;
  auVar94 = vmaxps_avx(auVar292,auVar300);
  auVar83 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar255 = vpminsd_avx(auVar202,auVar180);
  auVar319._16_16_ = auVar83;
  auVar319._0_16_ = auVar255;
  uVar73 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar326._4_4_ = uVar73;
  auVar326._0_4_ = uVar73;
  auVar326._8_4_ = uVar73;
  auVar326._12_4_ = uVar73;
  auVar326._16_4_ = uVar73;
  auVar326._20_4_ = uVar73;
  auVar326._24_4_ = uVar73;
  auVar326._28_4_ = uVar73;
  auVar14 = vmaxps_avx(auVar319,auVar326);
  auVar94 = vmaxps_avx(auVar94,auVar14);
  local_1b8._4_4_ = auVar94._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar94._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar94._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar94._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar94._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar94._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar94._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar94._28_4_;
  auVar83 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar255 = vpmaxsd_avx(auVar75,auVar106);
  auVar97._16_16_ = auVar83;
  auVar97._0_16_ = auVar255;
  auVar83 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar255 = vpmaxsd_avx(auVar138,auVar170);
  auVar130._16_16_ = auVar83;
  auVar130._0_16_ = auVar255;
  auVar94 = vminps_avx(auVar97,auVar130);
  auVar83 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar255 = vpmaxsd_avx(auVar202,auVar180);
  auVar131._16_16_ = auVar83;
  auVar131._0_16_ = auVar255;
  fVar137 = ray->tfar;
  auVar161._4_4_ = fVar137;
  auVar161._0_4_ = fVar137;
  auVar161._8_4_ = fVar137;
  auVar161._12_4_ = fVar137;
  auVar161._16_4_ = fVar137;
  auVar161._20_4_ = fVar137;
  auVar161._24_4_ = fVar137;
  auVar161._28_4_ = fVar137;
  auVar14 = vminps_avx(auVar131,auVar161);
  auVar94 = vminps_avx(auVar94,auVar14);
  auVar14._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar94._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar94._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar94._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar94._28_4_;
  auVar94 = vcmpps_avx(local_1b8,auVar14,2);
  auVar83 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar132._16_16_ = auVar83;
  auVar132._0_16_ = auVar83;
  auVar14 = vcvtdq2ps_avx(auVar132);
  auVar14 = vcmpps_avx(_DAT_01f7b060,auVar14,1);
  auVar94 = vandps_avx(auVar94,auVar14);
  uVar73 = vmovmskps_avx(auVar94);
  uVar67 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar73);
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  local_310 = prim;
LAB_009c3b3a:
  if (uVar67 == 0) {
LAB_009c58fc:
    return uVar67 != 0;
  }
  lVar68 = 0;
  if (uVar67 != 0) {
    for (; (uVar67 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  local_480 = (ulong)*(uint *)(local_310 + 2);
  local_318 = (ulong)*(uint *)(local_310 + lVar68 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_480].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_318);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar83 = *(undefined1 (*) [16])(_Var12 + uVar72 * (long)pvVar11);
  pfVar1 = (float *)(_Var12 + (uVar72 + 1) * (long)pvVar11);
  fVar137 = *pfVar1;
  fVar201 = pfVar1[1];
  fVar164 = pfVar1[2];
  fVar215 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar72 + 2) * (long)pvVar11);
  fVar165 = *pfVar1;
  fVar216 = pfVar1[1];
  fVar166 = pfVar1[2];
  fVar217 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar72 + 3));
  fVar167 = *pfVar1;
  fVar218 = pfVar1[1];
  fVar168 = pfVar1[2];
  fVar219 = pfVar1[3];
  lVar68 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar68 + (long)p_Var10 * uVar72);
  fVar169 = *pfVar1;
  fVar220 = pfVar1[1];
  fVar221 = pfVar1[2];
  fVar232 = pfVar1[3];
  pfVar1 = (float *)(lVar68 + (long)p_Var10 * (uVar72 + 1));
  fVar233 = *pfVar1;
  fVar234 = pfVar1[1];
  fVar235 = pfVar1[2];
  fVar237 = pfVar1[3];
  uVar71 = uVar67 - 1 & uVar67;
  pfVar1 = (float *)(lVar68 + (long)p_Var10 * (uVar72 + 2));
  fVar238 = *pfVar1;
  fVar303 = pfVar1[1];
  fVar265 = pfVar1[2];
  fVar309 = pfVar1[3];
  lVar13 = 0;
  if (uVar71 != 0) {
    for (; (uVar71 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar68 + (long)p_Var10 * (uVar72 + 3));
  fVar266 = *pfVar1;
  fVar310 = pfVar1[1];
  fVar267 = pfVar1[2];
  fVar311 = pfVar1[3];
  if (((uVar71 != 0) && (uVar72 = uVar71 - 1 & uVar71, uVar72 != 0)) && (lVar68 = 0, uVar72 != 0)) {
    for (; (uVar72 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  local_508._0_4_ =
       fVar169 * 0.16666667 + fVar233 * 0.6666667 + fVar238 * 0.16666667 + fVar266 * 0.0;
  local_508._4_4_ =
       fVar220 * 0.16666667 + fVar234 * 0.6666667 + fVar303 * 0.16666667 + fVar310 * 0.0;
  fStack_500 = fVar221 * 0.16666667 + fVar235 * 0.6666667 + fVar265 * 0.16666667 + fVar267 * 0.0;
  fStack_4fc = fVar232 * 0.16666667 + fVar237 * 0.6666667 + fVar309 * 0.16666667 + fVar311 * 0.0;
  auVar107._0_4_ = fVar238 * 0.5 + fVar266 * 0.0;
  auVar107._4_4_ = fVar303 * 0.5 + fVar310 * 0.0;
  auVar107._8_4_ = fVar265 * 0.5 + fVar267 * 0.0;
  auVar107._12_4_ = fVar309 * 0.5 + fVar311 * 0.0;
  auVar283._0_4_ = fVar233 * 0.0;
  auVar283._4_4_ = fVar234 * 0.0;
  auVar283._8_4_ = fVar235 * 0.0;
  auVar283._12_4_ = fVar237 * 0.0;
  auVar255 = vsubps_avx(auVar107,auVar283);
  auVar284._0_4_ = fVar169 * 0.5;
  auVar284._4_4_ = fVar220 * 0.5;
  auVar284._8_4_ = fVar221 * 0.5;
  auVar284._12_4_ = fVar232 * 0.5;
  auVar236 = vsubps_avx(auVar255,auVar284);
  fVar268 = auVar83._0_4_;
  fVar277 = auVar83._4_4_;
  fVar278 = auVar83._8_4_;
  fVar279 = auVar83._12_4_;
  auVar285._0_4_ = fVar268 * 0.16666667 + fVar137 * 0.6666667 + fVar165 * 0.16666667 + fVar167 * 0.0
  ;
  auVar285._4_4_ = fVar277 * 0.16666667 + fVar201 * 0.6666667 + fVar216 * 0.16666667 + fVar218 * 0.0
  ;
  auVar285._8_4_ = fVar278 * 0.16666667 + fVar164 * 0.6666667 + fVar166 * 0.16666667 + fVar168 * 0.0
  ;
  auVar285._12_4_ =
       fVar279 * 0.16666667 + fVar215 * 0.6666667 + fVar217 * 0.16666667 + fVar219 * 0.0;
  auVar295._0_4_ = fVar165 * 0.5 + fVar167 * 0.0;
  auVar295._4_4_ = fVar216 * 0.5 + fVar218 * 0.0;
  auVar295._8_4_ = fVar166 * 0.5 + fVar168 * 0.0;
  auVar295._12_4_ = fVar217 * 0.5 + fVar219 * 0.0;
  auVar304._0_4_ = fVar137 * 0.0;
  auVar304._4_4_ = fVar201 * 0.0;
  auVar304._8_4_ = fVar164 * 0.0;
  auVar304._12_4_ = fVar215 * 0.0;
  auVar83 = vsubps_avx(auVar295,auVar304);
  auVar305._0_4_ = fVar268 * 0.5;
  auVar305._4_4_ = fVar277 * 0.5;
  auVar305._8_4_ = fVar278 * 0.5;
  auVar305._12_4_ = fVar279 * 0.5;
  auVar124 = vsubps_avx(auVar83,auVar305);
  auVar316._0_4_ = fVar169 * 0.0;
  auVar316._4_4_ = fVar220 * 0.0;
  auVar316._8_4_ = fVar221 * 0.0;
  auVar316._12_4_ = fVar232 * 0.0;
  local_4a8._0_4_ =
       auVar316._0_4_ + fVar233 * 0.16666667 + fVar238 * 0.6666667 + fVar266 * 0.16666667;
  local_4a8._4_4_ =
       auVar316._4_4_ + fVar234 * 0.16666667 + fVar303 * 0.6666667 + fVar310 * 0.16666667;
  fStack_4a0 = auVar316._8_4_ + fVar235 * 0.16666667 + fVar265 * 0.6666667 + fVar267 * 0.16666667;
  fStack_49c = auVar316._12_4_ + fVar237 * 0.16666667 + fVar309 * 0.6666667 + fVar311 * 0.16666667;
  auVar251._0_4_ = fVar238 * 0.0 + fVar266 * 0.5;
  auVar251._4_4_ = fVar303 * 0.0 + fVar310 * 0.5;
  auVar251._8_4_ = fVar265 * 0.0 + fVar267 * 0.5;
  auVar251._12_4_ = fVar309 * 0.0 + fVar311 * 0.5;
  auVar171._0_4_ = fVar233 * 0.5;
  auVar171._4_4_ = fVar234 * 0.5;
  auVar171._8_4_ = fVar235 * 0.5;
  auVar171._12_4_ = fVar237 * 0.5;
  auVar83 = vsubps_avx(auVar251,auVar171);
  auVar5 = vsubps_avx(auVar83,auVar316);
  auVar203._0_4_ = fVar268 * 0.0;
  auVar203._4_4_ = fVar277 * 0.0;
  auVar203._8_4_ = fVar278 * 0.0;
  auVar203._12_4_ = fVar279 * 0.0;
  auVar252._0_4_ =
       fVar137 * 0.16666667 + fVar165 * 0.6666667 + fVar167 * 0.16666667 + auVar203._0_4_;
  auVar252._4_4_ =
       fVar201 * 0.16666667 + fVar216 * 0.6666667 + fVar218 * 0.16666667 + auVar203._4_4_;
  auVar252._8_4_ =
       fVar164 * 0.16666667 + fVar166 * 0.6666667 + fVar168 * 0.16666667 + auVar203._8_4_;
  auVar252._12_4_ =
       fVar215 * 0.16666667 + fVar217 * 0.6666667 + fVar219 * 0.16666667 + auVar203._12_4_;
  auVar223._0_4_ = fVar165 * 0.0 + fVar167 * 0.5;
  auVar223._4_4_ = fVar216 * 0.0 + fVar218 * 0.5;
  auVar223._8_4_ = fVar166 * 0.0 + fVar168 * 0.5;
  auVar223._12_4_ = fVar217 * 0.0 + fVar219 * 0.5;
  auVar181._0_4_ = fVar137 * 0.5;
  auVar181._4_4_ = fVar201 * 0.5;
  auVar181._8_4_ = fVar164 * 0.5;
  auVar181._12_4_ = fVar215 * 0.5;
  auVar83 = vsubps_avx(auVar223,auVar181);
  auVar142 = vsubps_avx(auVar83,auVar203);
  auVar83 = vshufps_avx(auVar236,auVar236,0xc9);
  auVar255 = vshufps_avx(auVar285,auVar285,0xc9);
  fVar169 = auVar236._0_4_;
  auVar224._0_4_ = fVar169 * auVar255._0_4_;
  fVar220 = auVar236._4_4_;
  auVar224._4_4_ = fVar220 * auVar255._4_4_;
  fVar221 = auVar236._8_4_;
  auVar224._8_4_ = fVar221 * auVar255._8_4_;
  fVar232 = auVar236._12_4_;
  auVar224._12_4_ = fVar232 * auVar255._12_4_;
  auVar239._0_4_ = auVar285._0_4_ * auVar83._0_4_;
  auVar239._4_4_ = auVar285._4_4_ * auVar83._4_4_;
  auVar239._8_4_ = auVar285._8_4_ * auVar83._8_4_;
  auVar239._12_4_ = auVar285._12_4_ * auVar83._12_4_;
  auVar255 = vsubps_avx(auVar239,auVar224);
  auVar156 = vshufps_avx(auVar255,auVar255,0xc9);
  auVar255 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar225._0_4_ = fVar169 * auVar255._0_4_;
  auVar225._4_4_ = fVar220 * auVar255._4_4_;
  auVar225._8_4_ = fVar221 * auVar255._8_4_;
  auVar225._12_4_ = fVar232 * auVar255._12_4_;
  auVar182._0_4_ = auVar124._0_4_ * auVar83._0_4_;
  auVar182._4_4_ = auVar124._4_4_ * auVar83._4_4_;
  auVar182._8_4_ = auVar124._8_4_ * auVar83._8_4_;
  auVar182._12_4_ = auVar124._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar182,auVar225);
  auVar124 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar83 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar255 = vshufps_avx(auVar252,auVar252,0xc9);
  fVar233 = auVar5._0_4_;
  auVar183._0_4_ = fVar233 * auVar255._0_4_;
  fVar234 = auVar5._4_4_;
  auVar183._4_4_ = fVar234 * auVar255._4_4_;
  fVar235 = auVar5._8_4_;
  auVar183._8_4_ = fVar235 * auVar255._8_4_;
  fVar237 = auVar5._12_4_;
  auVar183._12_4_ = fVar237 * auVar255._12_4_;
  auVar253._0_4_ = auVar252._0_4_ * auVar83._0_4_;
  auVar253._4_4_ = auVar252._4_4_ * auVar83._4_4_;
  auVar253._8_4_ = auVar252._8_4_ * auVar83._8_4_;
  auVar253._12_4_ = auVar252._12_4_ * auVar83._12_4_;
  auVar255 = vsubps_avx(auVar253,auVar183);
  auVar112 = vshufps_avx(auVar255,auVar255,0xc9);
  auVar255 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar254._0_4_ = auVar255._0_4_ * fVar233;
  auVar254._4_4_ = auVar255._4_4_ * fVar234;
  auVar254._8_4_ = auVar255._8_4_ * fVar235;
  auVar254._12_4_ = auVar255._12_4_ * fVar237;
  auVar204._0_4_ = auVar83._0_4_ * auVar142._0_4_;
  auVar204._4_4_ = auVar83._4_4_ * auVar142._4_4_;
  auVar204._8_4_ = auVar83._8_4_ * auVar142._8_4_;
  auVar204._12_4_ = auVar83._12_4_ * auVar142._12_4_;
  auVar255 = vsubps_avx(auVar204,auVar254);
  auVar83 = vdpps_avx(auVar156,auVar156,0x7f);
  auVar142 = vshufps_avx(auVar255,auVar255,0xc9);
  fVar165 = auVar83._0_4_;
  auVar256 = ZEXT416((uint)fVar165);
  auVar255 = vrsqrtss_avx(auVar256,auVar256);
  fVar137 = auVar255._0_4_;
  auVar255 = vdpps_avx(auVar156,auVar124,0x7f);
  auVar113 = ZEXT416((uint)(fVar137 * 1.5 - fVar165 * 0.5 * fVar137 * fVar137 * fVar137));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  fVar137 = auVar113._0_4_ * auVar156._0_4_;
  fVar201 = auVar113._4_4_ * auVar156._4_4_;
  fVar164 = auVar113._8_4_ * auVar156._8_4_;
  fVar215 = auVar113._12_4_ * auVar156._12_4_;
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar269._0_4_ = auVar124._0_4_ * auVar83._0_4_;
  auVar269._4_4_ = auVar124._4_4_ * auVar83._4_4_;
  auVar269._8_4_ = auVar124._8_4_ * auVar83._8_4_;
  auVar269._12_4_ = auVar124._12_4_ * auVar83._12_4_;
  auVar83 = vshufps_avx(auVar255,auVar255,0);
  auVar240._0_4_ = auVar83._0_4_ * auVar156._0_4_;
  auVar240._4_4_ = auVar83._4_4_ * auVar156._4_4_;
  auVar240._8_4_ = auVar83._8_4_ * auVar156._8_4_;
  auVar240._12_4_ = auVar83._12_4_ * auVar156._12_4_;
  auVar6 = vsubps_avx(auVar269,auVar240);
  auVar255 = vrcpss_avx(auVar256,auVar256);
  auVar83 = vdpps_avx(auVar112,auVar112,0x7f);
  auVar255 = ZEXT416((uint)(auVar255._0_4_ * (2.0 - fVar165 * auVar255._0_4_)));
  auVar156 = vshufps_avx(auVar255,auVar255,0);
  fVar165 = auVar83._0_4_;
  auVar256 = ZEXT416((uint)fVar165);
  auVar255 = vrsqrtss_avx(auVar256,auVar256);
  fVar216 = auVar255._0_4_;
  auVar255 = ZEXT416((uint)(fVar216 * 1.5 - fVar165 * 0.5 * fVar216 * fVar216 * fVar216));
  auVar124 = vshufps_avx(auVar255,auVar255,0);
  auVar255 = vdpps_avx(auVar112,auVar142,0x7f);
  fVar216 = auVar124._0_4_ * auVar112._0_4_;
  fVar166 = auVar124._4_4_ * auVar112._4_4_;
  fVar217 = auVar124._8_4_ * auVar112._8_4_;
  fVar167 = auVar124._12_4_ * auVar112._12_4_;
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar226._0_4_ = auVar83._0_4_ * auVar142._0_4_;
  auVar226._4_4_ = auVar83._4_4_ * auVar142._4_4_;
  auVar226._8_4_ = auVar83._8_4_ * auVar142._8_4_;
  auVar226._12_4_ = auVar83._12_4_ * auVar142._12_4_;
  auVar83 = vshufps_avx(auVar255,auVar255,0);
  auVar184._0_4_ = auVar83._0_4_ * auVar112._0_4_;
  auVar184._4_4_ = auVar83._4_4_ * auVar112._4_4_;
  auVar184._8_4_ = auVar83._8_4_ * auVar112._8_4_;
  auVar184._12_4_ = auVar83._12_4_ * auVar112._12_4_;
  auVar142 = vsubps_avx(auVar226,auVar184);
  auVar83 = vrcpss_avx(auVar256,auVar256);
  auVar83 = ZEXT416((uint)((2.0 - fVar165 * auVar83._0_4_) * auVar83._0_4_));
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar255 = vshufps_avx(_local_508,_local_508,0xff);
  auVar257._0_4_ = auVar255._0_4_ * fVar137;
  auVar257._4_4_ = auVar255._4_4_ * fVar201;
  auVar257._8_4_ = auVar255._8_4_ * fVar164;
  auVar257._12_4_ = auVar255._12_4_ * fVar215;
  _local_3f8 = vsubps_avx(_local_508,auVar257);
  auVar112 = vshufps_avx(auVar236,auVar236,0xff);
  auVar205._0_4_ =
       auVar112._0_4_ * fVar137 + auVar255._0_4_ * auVar113._0_4_ * auVar156._0_4_ * auVar6._0_4_;
  auVar205._4_4_ =
       auVar112._4_4_ * fVar201 + auVar255._4_4_ * auVar113._4_4_ * auVar156._4_4_ * auVar6._4_4_;
  auVar205._8_4_ =
       auVar112._8_4_ * fVar164 + auVar255._8_4_ * auVar113._8_4_ * auVar156._8_4_ * auVar6._8_4_;
  auVar205._12_4_ =
       auVar112._12_4_ * fVar215 +
       auVar255._12_4_ * auVar113._12_4_ * auVar156._12_4_ * auVar6._12_4_;
  auVar112 = vsubps_avx(auVar236,auVar205);
  local_408._0_4_ = auVar257._0_4_ + (float)local_508._0_4_;
  local_408._4_4_ = auVar257._4_4_ + (float)local_508._4_4_;
  fStack_400 = auVar257._8_4_ + fStack_500;
  fStack_3fc = auVar257._12_4_ + fStack_4fc;
  auVar255 = vshufps_avx(_local_4a8,_local_4a8,0xff);
  auVar108._0_4_ = fVar216 * auVar255._0_4_;
  auVar108._4_4_ = fVar166 * auVar255._4_4_;
  auVar108._8_4_ = fVar217 * auVar255._8_4_;
  auVar108._12_4_ = fVar167 * auVar255._12_4_;
  _local_418 = vsubps_avx(_local_4a8,auVar108);
  auVar156 = vshufps_avx(auVar5,auVar5,0xff);
  auVar76._0_4_ =
       fVar216 * auVar156._0_4_ + auVar255._0_4_ * auVar124._0_4_ * auVar142._0_4_ * auVar83._0_4_;
  auVar76._4_4_ =
       fVar166 * auVar156._4_4_ + auVar255._4_4_ * auVar124._4_4_ * auVar142._4_4_ * auVar83._4_4_;
  auVar76._8_4_ =
       fVar217 * auVar156._8_4_ + auVar255._8_4_ * auVar124._8_4_ * auVar142._8_4_ * auVar83._8_4_;
  auVar76._12_4_ =
       fVar167 * auVar156._12_4_ +
       auVar255._12_4_ * auVar124._12_4_ * auVar142._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar5,auVar76);
  local_478 = (float)local_4a8._0_4_ + auVar108._0_4_;
  fStack_474 = (float)local_4a8._4_4_ + auVar108._4_4_;
  fStack_470 = fStack_4a0 + auVar108._8_4_;
  fStack_46c = fStack_49c + auVar108._12_4_;
  local_428._0_4_ = local_3f8._0_4_ + auVar112._0_4_ * 0.33333334;
  local_428._4_4_ = local_3f8._4_4_ + auVar112._4_4_ * 0.33333334;
  fStack_420 = local_3f8._8_4_ + auVar112._8_4_ * 0.33333334;
  fStack_41c = local_3f8._12_4_ + auVar112._12_4_ * 0.33333334;
  auVar77._0_4_ = auVar83._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar83._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar83._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar83._12_4_ * 0.33333334;
  _local_438 = vsubps_avx(_local_418,auVar77);
  aVar4 = (ray->org).field_0;
  auVar156 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
  auVar255 = vmovsldup_avx(auVar156);
  auVar83 = vmovshdup_avx(auVar156);
  auVar156 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar137 = (pre->ray_space).vx.field_0.m128[0];
  fVar201 = (pre->ray_space).vx.field_0.m128[1];
  fVar164 = (pre->ray_space).vx.field_0.m128[2];
  fVar215 = (pre->ray_space).vx.field_0.m128[3];
  fVar165 = (pre->ray_space).vy.field_0.m128[0];
  fVar216 = (pre->ray_space).vy.field_0.m128[1];
  fVar166 = (pre->ray_space).vy.field_0.m128[2];
  fVar217 = (pre->ray_space).vy.field_0.m128[3];
  fVar167 = (pre->ray_space).vz.field_0.m128[0];
  fVar218 = (pre->ray_space).vz.field_0.m128[1];
  fVar168 = (pre->ray_space).vz.field_0.m128[2];
  fVar219 = (pre->ray_space).vz.field_0.m128[3];
  local_508._4_4_ = fVar201 * auVar255._4_4_ + fVar216 * auVar83._4_4_ + fVar218 * auVar156._4_4_;
  local_508._0_4_ = fVar137 * auVar255._0_4_ + fVar165 * auVar83._0_4_ + fVar167 * auVar156._0_4_;
  fStack_500 = fVar164 * auVar255._8_4_ + fVar166 * auVar83._8_4_ + fVar168 * auVar156._8_4_;
  fStack_4fc = fVar215 * auVar255._12_4_ + fVar217 * auVar83._12_4_ + fVar219 * auVar156._12_4_;
  auVar156 = vsubps_avx(_local_428,(undefined1  [16])aVar4);
  auVar255 = vmovsldup_avx(auVar156);
  auVar83 = vmovshdup_avx(auVar156);
  auVar156 = vshufps_avx(auVar156,auVar156,0xaa);
  local_4c8._4_4_ = fVar201 * auVar255._4_4_ + auVar83._4_4_ * fVar216 + fVar218 * auVar156._4_4_;
  local_4c8._0_4_ = fVar137 * auVar255._0_4_ + auVar83._0_4_ * fVar165 + fVar167 * auVar156._0_4_;
  fStack_4c0 = fVar164 * auVar255._8_4_ + auVar83._8_4_ * fVar166 + fVar168 * auVar156._8_4_;
  fStack_4bc = fVar215 * auVar255._12_4_ + auVar83._12_4_ * fVar217 + fVar219 * auVar156._12_4_;
  auVar255 = vsubps_avx(_local_438,(undefined1  [16])aVar4);
  auVar156 = vshufps_avx(auVar255,auVar255,0xaa);
  auVar83 = vmovshdup_avx(auVar255);
  auVar255 = vmovsldup_avx(auVar255);
  auVar328._0_8_ =
       CONCAT44(auVar83._4_4_ * fVar216 + auVar156._4_4_ * fVar218 + fVar201 * auVar255._4_4_,
                auVar83._0_4_ * fVar165 + auVar156._0_4_ * fVar167 + fVar137 * auVar255._0_4_);
  auVar328._8_4_ = auVar83._8_4_ * fVar166 + auVar156._8_4_ * fVar168 + fVar164 * auVar255._8_4_;
  auVar328._12_4_ = auVar83._12_4_ * fVar217 + auVar156._12_4_ * fVar219 + fVar215 * auVar255._12_4_
  ;
  auVar255 = vsubps_avx(_local_418,(undefined1  [16])aVar4);
  auVar156 = vshufps_avx(auVar255,auVar255,0xaa);
  auVar83 = vmovshdup_avx(auVar255);
  auVar255 = vmovsldup_avx(auVar255);
  auVar109._0_8_ =
       CONCAT44(auVar255._4_4_ * fVar201 + auVar83._4_4_ * fVar216 + auVar156._4_4_ * fVar218,
                auVar255._0_4_ * fVar137 + auVar83._0_4_ * fVar165 + auVar156._0_4_ * fVar167);
  auVar109._8_4_ = auVar255._8_4_ * fVar164 + auVar83._8_4_ * fVar166 + auVar156._8_4_ * fVar168;
  auVar109._12_4_ = auVar255._12_4_ * fVar215 + auVar83._12_4_ * fVar217 + auVar156._12_4_ * fVar219
  ;
  auVar255 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
  auVar156 = vshufps_avx(auVar255,auVar255,0xaa);
  auVar83 = vmovshdup_avx(auVar255);
  auVar255 = vmovsldup_avx(auVar255);
  auVar286._0_8_ =
       CONCAT44(auVar255._4_4_ * fVar201 + auVar83._4_4_ * fVar216 + auVar156._4_4_ * fVar218,
                auVar255._0_4_ * fVar137 + auVar83._0_4_ * fVar165 + auVar156._0_4_ * fVar167);
  auVar286._8_4_ = auVar255._8_4_ * fVar164 + auVar83._8_4_ * fVar166 + auVar156._8_4_ * fVar168;
  auVar286._12_4_ = auVar255._12_4_ * fVar215 + auVar83._12_4_ * fVar217 + auVar156._12_4_ * fVar219
  ;
  local_448._0_4_ = (fVar169 + auVar205._0_4_) * 0.33333334 + (float)local_408._0_4_;
  local_448._4_4_ = (fVar220 + auVar205._4_4_) * 0.33333334 + (float)local_408._4_4_;
  fStack_440 = (fVar221 + auVar205._8_4_) * 0.33333334 + fStack_400;
  fStack_43c = (fVar232 + auVar205._12_4_) * 0.33333334 + fStack_3fc;
  auVar255 = vsubps_avx(_local_448,(undefined1  [16])aVar4);
  auVar156 = vshufps_avx(auVar255,auVar255,0xaa);
  auVar83 = vmovshdup_avx(auVar255);
  auVar255 = vmovsldup_avx(auVar255);
  auVar258._0_8_ =
       CONCAT44(auVar255._4_4_ * fVar201 + auVar83._4_4_ * fVar216 + auVar156._4_4_ * fVar218,
                auVar255._0_4_ * fVar137 + auVar83._0_4_ * fVar165 + auVar156._0_4_ * fVar167);
  auVar258._8_4_ = auVar255._8_4_ * fVar164 + auVar83._8_4_ * fVar166 + auVar156._8_4_ * fVar168;
  auVar258._12_4_ = auVar255._12_4_ * fVar215 + auVar83._12_4_ * fVar217 + auVar156._12_4_ * fVar219
  ;
  auVar241._0_4_ = (fVar233 + auVar76._0_4_) * 0.33333334;
  auVar241._4_4_ = (fVar234 + auVar76._4_4_) * 0.33333334;
  auVar241._8_4_ = (fVar235 + auVar76._8_4_) * 0.33333334;
  auVar241._12_4_ = (fVar237 + auVar76._12_4_) * 0.33333334;
  auVar62._4_4_ = fStack_474;
  auVar62._0_4_ = local_478;
  auVar62._8_4_ = fStack_470;
  auVar62._12_4_ = fStack_46c;
  _local_2d8 = vsubps_avx(auVar62,auVar241);
  auVar255 = vsubps_avx(_local_2d8,(undefined1  [16])aVar4);
  auVar156 = vshufps_avx(auVar255,auVar255,0xaa);
  auVar83 = vmovshdup_avx(auVar255);
  auVar255 = vmovsldup_avx(auVar255);
  auVar242._0_8_ =
       CONCAT44(auVar83._4_4_ * fVar216 + auVar156._4_4_ * fVar218 + fVar201 * auVar255._4_4_,
                auVar83._0_4_ * fVar165 + auVar156._0_4_ * fVar167 + fVar137 * auVar255._0_4_);
  auVar242._8_4_ = auVar83._8_4_ * fVar166 + auVar156._8_4_ * fVar168 + fVar164 * auVar255._8_4_;
  auVar242._12_4_ = auVar83._12_4_ * fVar217 + auVar156._12_4_ * fVar219 + fVar215 * auVar255._12_4_
  ;
  auVar255 = vsubps_avx(auVar62,(undefined1  [16])aVar4);
  auVar156 = vshufps_avx(auVar255,auVar255,0xaa);
  auVar83 = vmovshdup_avx(auVar255);
  auVar255 = vmovsldup_avx(auVar255);
  auVar78._0_8_ =
       CONCAT44(fVar201 * auVar255._4_4_ + auVar83._4_4_ * fVar216 + auVar156._4_4_ * fVar218,
                fVar137 * auVar255._0_4_ + auVar83._0_4_ * fVar165 + auVar156._0_4_ * fVar167);
  auVar78._8_4_ = fVar164 * auVar255._8_4_ + auVar83._8_4_ * fVar166 + auVar156._8_4_ * fVar168;
  auVar78._12_4_ = fVar215 * auVar255._12_4_ + auVar83._12_4_ * fVar217 + auVar156._12_4_ * fVar219;
  _local_328 = vmovlhps_avx(_local_508,auVar286);
  _local_338 = vmovlhps_avx(_local_4c8,auVar258);
  _local_348 = vmovlhps_avx(auVar328,auVar242);
  _local_218 = vmovlhps_avx(auVar109,auVar78);
  auVar83 = vminps_avx(_local_328,_local_338);
  auVar255 = vminps_avx(_local_348,_local_218);
  auVar156 = vminps_avx(auVar83,auVar255);
  auVar83 = vmaxps_avx(_local_328,_local_338);
  auVar255 = vmaxps_avx(_local_348,_local_218);
  auVar83 = vmaxps_avx(auVar83,auVar255);
  auVar255 = vshufpd_avx(auVar156,auVar156,3);
  auVar156 = vminps_avx(auVar156,auVar255);
  auVar255 = vshufpd_avx(auVar83,auVar83,3);
  auVar255 = vmaxps_avx(auVar83,auVar255);
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar156,auVar227);
  auVar255 = vandps_avx(auVar255,auVar227);
  auVar83 = vmaxps_avx(auVar83,auVar255);
  auVar255 = vmovshdup_avx(auVar83);
  auVar83 = vmaxss_avx(auVar255,auVar83);
  fVar137 = auVar83._0_4_ * 9.536743e-07;
  local_378._8_8_ = local_508;
  local_378._0_8_ = local_508;
  auVar231 = ZEXT1664(local_378);
  local_388._8_8_ = local_4c8;
  local_388._0_8_ = local_4c8;
  local_398._8_8_ = auVar328._0_8_;
  local_398._0_8_ = auVar328._0_8_;
  auVar331 = ZEXT1664(local_398);
  local_3a8._8_8_ = auVar109._0_8_;
  local_3a8._0_8_ = auVar109._0_8_;
  local_3b8._8_8_ = auVar286._0_8_;
  local_3b8._0_8_ = auVar286._0_8_;
  auVar294 = ZEXT1664(local_3b8);
  local_3c8._8_8_ = auVar258._0_8_;
  local_3c8._0_8_ = auVar258._0_8_;
  auVar264 = ZEXT1664(local_3a8);
  local_3d8._8_8_ = auVar242._0_8_;
  local_3d8._0_8_ = auVar242._0_8_;
  auVar250 = ZEXT1664(local_388);
  local_3e8._8_8_ = auVar78._0_8_;
  local_3e8._0_8_ = auVar78._0_8_;
  local_228 = ZEXT416((uint)fVar137);
  auVar83 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
  local_78._16_16_ = auVar83;
  local_78._0_16_ = auVar83;
  auVar79._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
  auVar79._8_4_ = auVar83._8_4_ ^ 0x80000000;
  auVar79._12_4_ = auVar83._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar79;
  local_98._0_16_ = auVar79;
  bVar74 = false;
  uVar72 = 0;
  _local_1e8 = vsubps_avx(_local_338,_local_328);
  auVar302 = ZEXT1664(local_3d8);
  _local_1f8 = vsubps_avx(_local_348,_local_338);
  auVar308 = ZEXT1664(local_3e8);
  _local_208 = vsubps_avx(_local_218,_local_348);
  _local_258 = vsubps_avx(_local_408,_local_3f8);
  _local_268 = vsubps_avx(_local_448,_local_428);
  auVar276 = ZEXT1664(local_3c8);
  _local_278 = vsubps_avx(_local_2d8,_local_438);
  auVar63._4_4_ = fStack_474;
  auVar63._0_4_ = local_478;
  auVar63._8_4_ = fStack_470;
  auVar63._12_4_ = fStack_46c;
  _local_288 = vsubps_avx(auVar63,_local_418);
  _local_4f8 = ZEXT816(0x3f80000000000000);
  auVar320 = ZEXT1664(_local_4f8);
LAB_009c432a:
  auVar256 = auVar320._0_16_;
  auVar83 = vshufps_avx(auVar256,auVar256,0x50);
  auVar322._8_4_ = 0x3f800000;
  auVar322._0_8_ = 0x3f8000003f800000;
  auVar322._12_4_ = 0x3f800000;
  auVar327._16_4_ = 0x3f800000;
  auVar327._0_16_ = auVar322;
  auVar327._20_4_ = 0x3f800000;
  auVar327._24_4_ = 0x3f800000;
  auVar327._28_4_ = 0x3f800000;
  auVar255 = vsubps_avx(auVar322,auVar83);
  fVar137 = auVar83._0_4_;
  fVar201 = auVar83._4_4_;
  fVar164 = auVar83._8_4_;
  fVar215 = auVar83._12_4_;
  fVar165 = auVar255._0_4_;
  fVar216 = auVar255._4_4_;
  fVar166 = auVar255._8_4_;
  fVar217 = auVar255._12_4_;
  auVar172._0_4_ = auVar294._0_4_ * fVar137 + fVar165 * auVar231._0_4_;
  auVar172._4_4_ = auVar294._4_4_ * fVar201 + fVar216 * auVar231._4_4_;
  auVar172._8_4_ = auVar294._8_4_ * fVar164 + fVar166 * auVar231._8_4_;
  auVar172._12_4_ = auVar294._12_4_ * fVar215 + fVar217 * auVar231._12_4_;
  auVar139._0_4_ = auVar276._0_4_ * fVar137 + fVar165 * auVar250._0_4_;
  auVar139._4_4_ = auVar276._4_4_ * fVar201 + fVar216 * auVar250._4_4_;
  auVar139._8_4_ = auVar276._8_4_ * fVar164 + fVar166 * auVar250._8_4_;
  auVar139._12_4_ = auVar276._12_4_ * fVar215 + fVar217 * auVar250._12_4_;
  auVar243._0_4_ = auVar302._0_4_ * fVar137 + auVar331._0_4_ * fVar165;
  auVar243._4_4_ = auVar302._4_4_ * fVar201 + auVar331._4_4_ * fVar216;
  auVar243._8_4_ = auVar302._8_4_ * fVar164 + auVar331._8_4_ * fVar166;
  auVar243._12_4_ = auVar302._12_4_ * fVar215 + auVar331._12_4_ * fVar217;
  auVar185._0_4_ = auVar308._0_4_ * fVar137 + auVar264._0_4_ * fVar165;
  auVar185._4_4_ = auVar308._4_4_ * fVar201 + auVar264._4_4_ * fVar216;
  auVar185._8_4_ = auVar308._8_4_ * fVar164 + auVar264._8_4_ * fVar166;
  auVar185._12_4_ = auVar308._12_4_ * fVar215 + auVar264._12_4_ * fVar217;
  auVar83 = vmovshdup_avx(_local_4f8);
  auVar255 = vshufps_avx(_local_4f8,_local_4f8,0);
  auVar274._16_16_ = auVar255;
  auVar274._0_16_ = auVar255;
  auVar156 = vshufps_avx(_local_4f8,_local_4f8,0x55);
  auVar99._16_16_ = auVar156;
  auVar99._0_16_ = auVar156;
  auVar94 = vsubps_avx(auVar99,auVar274);
  auVar156 = vshufps_avx(auVar172,auVar172,0);
  auVar124 = vshufps_avx(auVar172,auVar172,0x55);
  auVar112 = vshufps_avx(auVar139,auVar139,0);
  auVar142 = vshufps_avx(auVar139,auVar139,0x55);
  auVar113 = vshufps_avx(auVar243,auVar243,0);
  auVar236 = vshufps_avx(auVar243,auVar243,0x55);
  auVar5 = vshufps_avx(auVar185,auVar185,0);
  auVar6 = vshufps_avx(auVar185,auVar185,0x55);
  auVar83 = ZEXT416((uint)((auVar83._0_4_ - local_4f8._0_4_) * 0.04761905));
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar293._0_4_ = auVar255._0_4_ + auVar94._0_4_ * 0.0;
  auVar293._4_4_ = auVar255._4_4_ + auVar94._4_4_ * 0.14285715;
  auVar293._8_4_ = auVar255._8_4_ + auVar94._8_4_ * 0.2857143;
  auVar293._12_4_ = auVar255._12_4_ + auVar94._12_4_ * 0.42857146;
  auVar293._16_4_ = auVar255._0_4_ + auVar94._16_4_ * 0.5714286;
  auVar293._20_4_ = auVar255._4_4_ + auVar94._20_4_ * 0.71428573;
  auVar293._24_4_ = auVar255._8_4_ + auVar94._24_4_ * 0.8571429;
  auVar293._28_4_ = auVar255._12_4_ + auVar94._28_4_;
  auVar15 = vsubps_avx(auVar327,auVar293);
  fVar137 = auVar112._0_4_;
  fVar164 = auVar112._4_4_;
  fVar165 = auVar112._8_4_;
  fVar166 = auVar112._12_4_;
  fVar268 = auVar15._0_4_;
  fVar277 = auVar15._4_4_;
  fVar278 = auVar15._8_4_;
  fVar279 = auVar15._12_4_;
  fVar280 = auVar15._16_4_;
  fVar281 = auVar15._20_4_;
  fVar282 = auVar15._24_4_;
  fVar238 = auVar142._0_4_;
  fVar265 = auVar142._4_4_;
  fVar266 = auVar142._8_4_;
  fVar267 = auVar142._12_4_;
  fVar321 = auVar124._12_4_ + 1.0;
  fVar233 = auVar113._0_4_;
  fVar234 = auVar113._4_4_;
  fVar235 = auVar113._8_4_;
  fVar237 = auVar113._12_4_;
  fVar167 = fVar233 * auVar293._0_4_ + fVar268 * fVar137;
  fVar218 = fVar234 * auVar293._4_4_ + fVar277 * fVar164;
  fVar168 = fVar235 * auVar293._8_4_ + fVar278 * fVar165;
  fVar219 = fVar237 * auVar293._12_4_ + fVar279 * fVar166;
  fVar169 = fVar233 * auVar293._16_4_ + fVar280 * fVar137;
  fVar220 = fVar234 * auVar293._20_4_ + fVar281 * fVar164;
  fVar221 = fVar235 * auVar293._24_4_ + fVar282 * fVar165;
  fVar201 = auVar236._0_4_;
  fVar215 = auVar236._4_4_;
  fVar216 = auVar236._8_4_;
  fVar217 = auVar236._12_4_;
  fVar303 = fVar238 * fVar268 + auVar293._0_4_ * fVar201;
  fVar309 = fVar265 * fVar277 + auVar293._4_4_ * fVar215;
  fVar310 = fVar266 * fVar278 + auVar293._8_4_ * fVar216;
  fVar311 = fVar267 * fVar279 + auVar293._12_4_ * fVar217;
  fVar312 = fVar238 * fVar280 + auVar293._16_4_ * fVar201;
  fVar313 = fVar265 * fVar281 + auVar293._20_4_ * fVar215;
  fVar314 = fVar266 * fVar282 + auVar293._24_4_ * fVar216;
  fVar315 = fVar267 + fVar166;
  auVar255 = vshufps_avx(auVar172,auVar172,0xaa);
  auVar112 = vshufps_avx(auVar172,auVar172,0xff);
  fVar232 = fVar237 + 0.0;
  auVar142 = vshufps_avx(auVar139,auVar139,0xaa);
  auVar113 = vshufps_avx(auVar139,auVar139,0xff);
  auVar199._0_4_ =
       fVar268 * (auVar293._0_4_ * fVar137 + fVar268 * auVar156._0_4_) + auVar293._0_4_ * fVar167;
  auVar199._4_4_ =
       fVar277 * (auVar293._4_4_ * fVar164 + fVar277 * auVar156._4_4_) + auVar293._4_4_ * fVar218;
  auVar199._8_4_ =
       fVar278 * (auVar293._8_4_ * fVar165 + fVar278 * auVar156._8_4_) + auVar293._8_4_ * fVar168;
  auVar199._12_4_ =
       fVar279 * (auVar293._12_4_ * fVar166 + fVar279 * auVar156._12_4_) + auVar293._12_4_ * fVar219
  ;
  auVar199._16_4_ =
       fVar280 * (auVar293._16_4_ * fVar137 + fVar280 * auVar156._0_4_) + auVar293._16_4_ * fVar169;
  auVar199._20_4_ =
       fVar281 * (auVar293._20_4_ * fVar164 + fVar281 * auVar156._4_4_) + auVar293._20_4_ * fVar220;
  auVar199._24_4_ =
       fVar282 * (auVar293._24_4_ * fVar165 + fVar282 * auVar156._8_4_) + auVar293._24_4_ * fVar221;
  auVar199._28_4_ = auVar156._12_4_ + 1.0 + fVar217;
  auVar213._0_4_ =
       fVar268 * (fVar238 * auVar293._0_4_ + auVar124._0_4_ * fVar268) + auVar293._0_4_ * fVar303;
  auVar213._4_4_ =
       fVar277 * (fVar265 * auVar293._4_4_ + auVar124._4_4_ * fVar277) + auVar293._4_4_ * fVar309;
  auVar213._8_4_ =
       fVar278 * (fVar266 * auVar293._8_4_ + auVar124._8_4_ * fVar278) + auVar293._8_4_ * fVar310;
  auVar213._12_4_ =
       fVar279 * (fVar267 * auVar293._12_4_ + auVar124._12_4_ * fVar279) + auVar293._12_4_ * fVar311
  ;
  auVar213._16_4_ =
       fVar280 * (fVar238 * auVar293._16_4_ + auVar124._0_4_ * fVar280) + auVar293._16_4_ * fVar312;
  auVar213._20_4_ =
       fVar281 * (fVar265 * auVar293._20_4_ + auVar124._4_4_ * fVar281) + auVar293._20_4_ * fVar313;
  auVar213._24_4_ =
       fVar282 * (fVar266 * auVar293._24_4_ + auVar124._8_4_ * fVar282) + auVar293._24_4_ * fVar314;
  auVar213._28_4_ = auVar6._12_4_ + fVar217;
  auVar100._0_4_ =
       fVar268 * fVar167 + auVar293._0_4_ * (fVar233 * fVar268 + auVar5._0_4_ * auVar293._0_4_);
  auVar100._4_4_ =
       fVar277 * fVar218 + auVar293._4_4_ * (fVar234 * fVar277 + auVar5._4_4_ * auVar293._4_4_);
  auVar100._8_4_ =
       fVar278 * fVar168 + auVar293._8_4_ * (fVar235 * fVar278 + auVar5._8_4_ * auVar293._8_4_);
  auVar100._12_4_ =
       fVar279 * fVar219 + auVar293._12_4_ * (fVar237 * fVar279 + auVar5._12_4_ * auVar293._12_4_);
  auVar100._16_4_ =
       fVar280 * fVar169 + auVar293._16_4_ * (fVar233 * fVar280 + auVar5._0_4_ * auVar293._16_4_);
  auVar100._20_4_ =
       fVar281 * fVar220 + auVar293._20_4_ * (fVar234 * fVar281 + auVar5._4_4_ * auVar293._20_4_);
  auVar100._24_4_ =
       fVar282 * fVar221 + auVar293._24_4_ * (fVar235 * fVar282 + auVar5._8_4_ * auVar293._24_4_);
  auVar100._28_4_ = fVar166 + 1.0 + fVar232;
  auVar301._0_4_ =
       fVar268 * fVar303 + auVar293._0_4_ * (auVar6._0_4_ * auVar293._0_4_ + fVar268 * fVar201);
  auVar301._4_4_ =
       fVar277 * fVar309 + auVar293._4_4_ * (auVar6._4_4_ * auVar293._4_4_ + fVar277 * fVar215);
  auVar301._8_4_ =
       fVar278 * fVar310 + auVar293._8_4_ * (auVar6._8_4_ * auVar293._8_4_ + fVar278 * fVar216);
  auVar301._12_4_ =
       fVar279 * fVar311 + auVar293._12_4_ * (auVar6._12_4_ * auVar293._12_4_ + fVar279 * fVar217);
  auVar301._16_4_ =
       fVar280 * fVar312 + auVar293._16_4_ * (auVar6._0_4_ * auVar293._16_4_ + fVar280 * fVar201);
  auVar301._20_4_ =
       fVar281 * fVar313 + auVar293._20_4_ * (auVar6._4_4_ * auVar293._20_4_ + fVar281 * fVar215);
  auVar301._24_4_ =
       fVar282 * fVar314 + auVar293._24_4_ * (auVar6._8_4_ * auVar293._24_4_ + fVar282 * fVar216);
  auVar301._28_4_ = fVar232 + fVar217 + 0.0;
  local_d8._0_4_ = fVar268 * auVar199._0_4_ + auVar293._0_4_ * auVar100._0_4_;
  local_d8._4_4_ = fVar277 * auVar199._4_4_ + auVar293._4_4_ * auVar100._4_4_;
  local_d8._8_4_ = fVar278 * auVar199._8_4_ + auVar293._8_4_ * auVar100._8_4_;
  local_d8._12_4_ = fVar279 * auVar199._12_4_ + auVar293._12_4_ * auVar100._12_4_;
  local_d8._16_4_ = fVar280 * auVar199._16_4_ + auVar293._16_4_ * auVar100._16_4_;
  local_d8._20_4_ = fVar281 * auVar199._20_4_ + auVar293._20_4_ * auVar100._20_4_;
  local_d8._24_4_ = fVar282 * auVar199._24_4_ + auVar293._24_4_ * auVar100._24_4_;
  local_d8._28_4_ = fVar315 + fVar217 + 0.0;
  auVar179._0_4_ = fVar268 * auVar213._0_4_ + auVar293._0_4_ * auVar301._0_4_;
  auVar179._4_4_ = fVar277 * auVar213._4_4_ + auVar293._4_4_ * auVar301._4_4_;
  auVar179._8_4_ = fVar278 * auVar213._8_4_ + auVar293._8_4_ * auVar301._8_4_;
  auVar179._12_4_ = fVar279 * auVar213._12_4_ + auVar293._12_4_ * auVar301._12_4_;
  auVar179._16_4_ = fVar280 * auVar213._16_4_ + auVar293._16_4_ * auVar301._16_4_;
  auVar179._20_4_ = fVar281 * auVar213._20_4_ + auVar293._20_4_ * auVar301._20_4_;
  auVar179._24_4_ = fVar282 * auVar213._24_4_ + auVar293._24_4_ * auVar301._24_4_;
  auVar179._28_4_ = fVar315 + fVar232;
  auVar16 = vsubps_avx(auVar100,auVar199);
  auVar94 = vsubps_avx(auVar301,auVar213);
  local_248._0_4_ = auVar83._0_4_;
  local_248._4_4_ = auVar83._4_4_;
  fStack_240 = auVar83._8_4_;
  fStack_23c = auVar83._12_4_;
  local_118 = (float)local_248._0_4_ * auVar16._0_4_ * 3.0;
  fStack_114 = (float)local_248._4_4_ * auVar16._4_4_ * 3.0;
  auVar24._4_4_ = fStack_114;
  auVar24._0_4_ = local_118;
  fStack_110 = fStack_240 * auVar16._8_4_ * 3.0;
  auVar24._8_4_ = fStack_110;
  fStack_10c = fStack_23c * auVar16._12_4_ * 3.0;
  auVar24._12_4_ = fStack_10c;
  fStack_108 = (float)local_248._0_4_ * auVar16._16_4_ * 3.0;
  auVar24._16_4_ = fStack_108;
  fStack_104 = (float)local_248._4_4_ * auVar16._20_4_ * 3.0;
  auVar24._20_4_ = fStack_104;
  fStack_100 = fStack_240 * auVar16._24_4_ * 3.0;
  auVar24._24_4_ = fStack_100;
  auVar24._28_4_ = auVar16._28_4_;
  local_138 = (float)local_248._0_4_ * auVar94._0_4_ * 3.0;
  fStack_134 = (float)local_248._4_4_ * auVar94._4_4_ * 3.0;
  auVar25._4_4_ = fStack_134;
  auVar25._0_4_ = local_138;
  fStack_130 = fStack_240 * auVar94._8_4_ * 3.0;
  auVar25._8_4_ = fStack_130;
  fStack_12c = fStack_23c * auVar94._12_4_ * 3.0;
  auVar25._12_4_ = fStack_12c;
  fStack_128 = (float)local_248._0_4_ * auVar94._16_4_ * 3.0;
  auVar25._16_4_ = fStack_128;
  fStack_124 = (float)local_248._4_4_ * auVar94._20_4_ * 3.0;
  auVar25._20_4_ = fStack_124;
  fStack_120 = fStack_240 * auVar94._24_4_ * 3.0;
  auVar25._24_4_ = fStack_120;
  auVar25._28_4_ = fVar315;
  auVar14 = vsubps_avx(local_d8,auVar24);
  auVar94 = vperm2f128_avx(auVar14,auVar14,1);
  auVar94 = vshufps_avx(auVar94,auVar14,0x30);
  auVar94 = vshufps_avx(auVar14,auVar94,0x29);
  auVar17 = vsubps_avx(auVar179,auVar25);
  auVar14 = vperm2f128_avx(auVar17,auVar17,1);
  auVar14 = vshufps_avx(auVar14,auVar17,0x30);
  _local_4c8 = vshufps_avx(auVar17,auVar14,0x29);
  fVar313 = auVar142._0_4_;
  fVar314 = auVar142._4_4_;
  fVar332 = auVar142._8_4_;
  fVar166 = auVar255._12_4_;
  fVar234 = auVar113._0_4_;
  fVar237 = auVar113._4_4_;
  fVar303 = auVar113._8_4_;
  fVar309 = auVar113._12_4_;
  auVar83 = vshufps_avx(auVar243,auVar243,0xaa);
  fVar137 = auVar83._0_4_;
  fVar164 = auVar83._4_4_;
  fVar165 = auVar83._8_4_;
  fVar217 = auVar83._12_4_;
  fVar168 = auVar293._0_4_ * fVar137 + fVar313 * fVar268;
  fVar219 = auVar293._4_4_ * fVar164 + fVar314 * fVar277;
  fVar169 = auVar293._8_4_ * fVar165 + fVar332 * fVar278;
  fVar220 = auVar293._12_4_ * fVar217 + auVar142._12_4_ * fVar279;
  fVar221 = auVar293._16_4_ * fVar137 + fVar313 * fVar280;
  fVar232 = auVar293._20_4_ * fVar164 + fVar314 * fVar281;
  fVar233 = auVar293._24_4_ * fVar165 + fVar332 * fVar282;
  auVar83 = vshufps_avx(auVar243,auVar243,0xff);
  fVar201 = auVar83._0_4_;
  fVar215 = auVar83._4_4_;
  fVar216 = auVar83._8_4_;
  fVar167 = auVar83._12_4_;
  fVar235 = auVar293._0_4_ * fVar201 + fVar234 * fVar268;
  fVar238 = auVar293._4_4_ * fVar215 + fVar237 * fVar277;
  fVar265 = auVar293._8_4_ * fVar216 + fVar303 * fVar278;
  fVar266 = auVar293._12_4_ * fVar167 + fVar309 * fVar279;
  fVar310 = auVar293._16_4_ * fVar201 + fVar234 * fVar280;
  fVar267 = auVar293._20_4_ * fVar215 + fVar237 * fVar281;
  fVar311 = auVar293._24_4_ * fVar216 + fVar303 * fVar282;
  auVar83 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar312 = auVar83._12_4_ + fVar217;
  auVar156 = vshufps_avx(auVar185,auVar185,0xff);
  fVar218 = auVar156._12_4_;
  auVar101._0_4_ =
       fVar268 * (fVar313 * auVar293._0_4_ + fVar268 * auVar255._0_4_) + auVar293._0_4_ * fVar168;
  auVar101._4_4_ =
       fVar277 * (fVar314 * auVar293._4_4_ + fVar277 * auVar255._4_4_) + auVar293._4_4_ * fVar219;
  auVar101._8_4_ =
       fVar278 * (fVar332 * auVar293._8_4_ + fVar278 * auVar255._8_4_) + auVar293._8_4_ * fVar169;
  auVar101._12_4_ =
       fVar279 * (auVar142._12_4_ * auVar293._12_4_ + fVar279 * fVar166) + auVar293._12_4_ * fVar220
  ;
  auVar101._16_4_ =
       fVar280 * (fVar313 * auVar293._16_4_ + fVar280 * auVar255._0_4_) + auVar293._16_4_ * fVar221;
  auVar101._20_4_ =
       fVar281 * (fVar314 * auVar293._20_4_ + fVar281 * auVar255._4_4_) + auVar293._20_4_ * fVar232;
  auVar101._24_4_ =
       fVar282 * (fVar332 * auVar293._24_4_ + fVar282 * auVar255._8_4_) + auVar293._24_4_ * fVar233;
  auVar101._28_4_ = local_4c8._28_4_ + fVar166 + fVar218;
  auVar133._0_4_ =
       fVar268 * (fVar234 * auVar293._0_4_ + auVar112._0_4_ * fVar268) + auVar293._0_4_ * fVar235;
  auVar133._4_4_ =
       fVar277 * (fVar237 * auVar293._4_4_ + auVar112._4_4_ * fVar277) + auVar293._4_4_ * fVar238;
  auVar133._8_4_ =
       fVar278 * (fVar303 * auVar293._8_4_ + auVar112._8_4_ * fVar278) + auVar293._8_4_ * fVar265;
  auVar133._12_4_ =
       fVar279 * (fVar309 * auVar293._12_4_ + auVar112._12_4_ * fVar279) + auVar293._12_4_ * fVar266
  ;
  auVar133._16_4_ =
       fVar280 * (fVar234 * auVar293._16_4_ + auVar112._0_4_ * fVar280) + auVar293._16_4_ * fVar310;
  auVar133._20_4_ =
       fVar281 * (fVar237 * auVar293._20_4_ + auVar112._4_4_ * fVar281) + auVar293._20_4_ * fVar267;
  auVar133._24_4_ =
       fVar282 * (fVar303 * auVar293._24_4_ + auVar112._8_4_ * fVar282) + auVar293._24_4_ * fVar311;
  auVar133._28_4_ = fVar166 + auVar14._28_4_ + fVar218;
  auVar14 = vperm2f128_avx(local_d8,local_d8,1);
  auVar14 = vshufps_avx(auVar14,local_d8,0x30);
  local_368 = vshufps_avx(local_d8,auVar14,0x29);
  auVar214._0_4_ =
       auVar293._0_4_ * (auVar83._0_4_ * auVar293._0_4_ + fVar268 * fVar137) + fVar268 * fVar168;
  auVar214._4_4_ =
       auVar293._4_4_ * (auVar83._4_4_ * auVar293._4_4_ + fVar277 * fVar164) + fVar277 * fVar219;
  auVar214._8_4_ =
       auVar293._8_4_ * (auVar83._8_4_ * auVar293._8_4_ + fVar278 * fVar165) + fVar278 * fVar169;
  auVar214._12_4_ =
       auVar293._12_4_ * (auVar83._12_4_ * auVar293._12_4_ + fVar279 * fVar217) + fVar279 * fVar220;
  auVar214._16_4_ =
       auVar293._16_4_ * (auVar83._0_4_ * auVar293._16_4_ + fVar280 * fVar137) + fVar280 * fVar221;
  auVar214._20_4_ =
       auVar293._20_4_ * (auVar83._4_4_ * auVar293._20_4_ + fVar281 * fVar164) + fVar281 * fVar232;
  auVar214._24_4_ =
       auVar293._24_4_ * (auVar83._8_4_ * auVar293._24_4_ + fVar282 * fVar165) + fVar282 * fVar233;
  auVar214._28_4_ = fVar312 + fVar321 + auVar213._28_4_;
  auVar263._0_4_ =
       fVar268 * fVar235 + auVar293._0_4_ * (auVar293._0_4_ * auVar156._0_4_ + fVar268 * fVar201);
  auVar263._4_4_ =
       fVar277 * fVar238 + auVar293._4_4_ * (auVar293._4_4_ * auVar156._4_4_ + fVar277 * fVar215);
  auVar263._8_4_ =
       fVar278 * fVar265 + auVar293._8_4_ * (auVar293._8_4_ * auVar156._8_4_ + fVar278 * fVar216);
  auVar263._12_4_ =
       fVar279 * fVar266 + auVar293._12_4_ * (auVar293._12_4_ * fVar218 + fVar279 * fVar167);
  auVar263._16_4_ =
       fVar280 * fVar310 + auVar293._16_4_ * (auVar293._16_4_ * auVar156._0_4_ + fVar280 * fVar201);
  auVar263._20_4_ =
       fVar281 * fVar267 + auVar293._20_4_ * (auVar293._20_4_ * auVar156._4_4_ + fVar281 * fVar215);
  auVar263._24_4_ =
       fVar282 * fVar311 + auVar293._24_4_ * (auVar293._24_4_ * auVar156._8_4_ + fVar282 * fVar216);
  auVar263._28_4_ = fVar321 + fVar309 + fVar218 + fVar167;
  auVar249._0_4_ = fVar268 * auVar101._0_4_ + auVar293._0_4_ * auVar214._0_4_;
  auVar249._4_4_ = fVar277 * auVar101._4_4_ + auVar293._4_4_ * auVar214._4_4_;
  auVar249._8_4_ = fVar278 * auVar101._8_4_ + auVar293._8_4_ * auVar214._8_4_;
  auVar249._12_4_ = fVar279 * auVar101._12_4_ + auVar293._12_4_ * auVar214._12_4_;
  auVar249._16_4_ = fVar280 * auVar101._16_4_ + auVar293._16_4_ * auVar214._16_4_;
  auVar249._20_4_ = fVar281 * auVar101._20_4_ + auVar293._20_4_ * auVar214._20_4_;
  auVar249._24_4_ = fVar282 * auVar101._24_4_ + auVar293._24_4_ * auVar214._24_4_;
  auVar249._28_4_ = fVar312 + fVar218 + fVar167;
  auVar275._0_4_ = fVar268 * auVar133._0_4_ + auVar293._0_4_ * auVar263._0_4_;
  auVar275._4_4_ = fVar277 * auVar133._4_4_ + auVar293._4_4_ * auVar263._4_4_;
  auVar275._8_4_ = fVar278 * auVar133._8_4_ + auVar293._8_4_ * auVar263._8_4_;
  auVar275._12_4_ = fVar279 * auVar133._12_4_ + auVar293._12_4_ * auVar263._12_4_;
  auVar275._16_4_ = fVar280 * auVar133._16_4_ + auVar293._16_4_ * auVar263._16_4_;
  auVar275._20_4_ = fVar281 * auVar133._20_4_ + auVar293._20_4_ * auVar263._20_4_;
  auVar275._24_4_ = fVar282 * auVar133._24_4_ + auVar293._24_4_ * auVar263._24_4_;
  auVar275._28_4_ = auVar15._28_4_ + auVar293._28_4_;
  auVar15 = vsubps_avx(auVar214,auVar101);
  auVar14 = vsubps_avx(auVar263,auVar133);
  local_158 = (float)local_248._0_4_ * auVar15._0_4_ * 3.0;
  fStack_154 = (float)local_248._4_4_ * auVar15._4_4_ * 3.0;
  auVar26._4_4_ = fStack_154;
  auVar26._0_4_ = local_158;
  fStack_150 = fStack_240 * auVar15._8_4_ * 3.0;
  auVar26._8_4_ = fStack_150;
  fStack_14c = fStack_23c * auVar15._12_4_ * 3.0;
  auVar26._12_4_ = fStack_14c;
  fStack_148 = (float)local_248._0_4_ * auVar15._16_4_ * 3.0;
  auVar26._16_4_ = fStack_148;
  fStack_144 = (float)local_248._4_4_ * auVar15._20_4_ * 3.0;
  auVar26._20_4_ = fStack_144;
  fStack_140 = fStack_240 * auVar15._24_4_ * 3.0;
  auVar26._24_4_ = fStack_140;
  auVar26._28_4_ = auVar15._28_4_;
  local_178 = (float)local_248._0_4_ * auVar14._0_4_ * 3.0;
  fStack_174 = (float)local_248._4_4_ * auVar14._4_4_ * 3.0;
  auVar27._4_4_ = fStack_174;
  auVar27._0_4_ = local_178;
  fStack_170 = fStack_240 * auVar14._8_4_ * 3.0;
  auVar27._8_4_ = fStack_170;
  fStack_16c = fStack_23c * auVar14._12_4_ * 3.0;
  auVar27._12_4_ = fStack_16c;
  fStack_168 = (float)local_248._0_4_ * auVar14._16_4_ * 3.0;
  auVar27._16_4_ = fStack_168;
  fStack_164 = (float)local_248._4_4_ * auVar14._20_4_ * 3.0;
  auVar27._20_4_ = fStack_164;
  fStack_160 = fStack_240 * auVar14._24_4_ * 3.0;
  auVar27._24_4_ = fStack_160;
  auVar27._28_4_ = auVar214._28_4_;
  auVar14 = vperm2f128_avx(auVar249,auVar249,1);
  auVar14 = vshufps_avx(auVar14,auVar249,0x30);
  auVar18 = vshufps_avx(auVar249,auVar14,0x29);
  auVar17 = vsubps_avx(auVar249,auVar26);
  auVar14 = vperm2f128_avx(auVar17,auVar17,1);
  auVar14 = vshufps_avx(auVar14,auVar17,0x30);
  _local_248 = vshufps_avx(auVar17,auVar14,0x29);
  auVar98 = _local_248;
  auVar17 = vsubps_avx(auVar275,auVar27);
  auVar14 = vperm2f128_avx(auVar17,auVar17,1);
  auVar14 = vshufps_avx(auVar14,auVar17,0x30);
  local_b8 = vshufps_avx(auVar17,auVar14,0x29);
  auVar17 = vsubps_avx(auVar249,local_d8);
  auVar19 = vsubps_avx(auVar18,local_368);
  fVar137 = auVar19._0_4_ + auVar17._0_4_;
  fVar201 = auVar19._4_4_ + auVar17._4_4_;
  fVar164 = auVar19._8_4_ + auVar17._8_4_;
  fVar215 = auVar19._12_4_ + auVar17._12_4_;
  fVar165 = auVar19._16_4_ + auVar17._16_4_;
  fVar216 = auVar19._20_4_ + auVar17._20_4_;
  fVar166 = auVar19._24_4_ + auVar17._24_4_;
  auVar14 = vperm2f128_avx(auVar179,auVar179,1);
  auVar14 = vshufps_avx(auVar14,auVar179,0x30);
  local_f8 = vshufps_avx(auVar179,auVar14,0x29);
  auVar14 = vperm2f128_avx(auVar275,auVar275,1);
  auVar14 = vshufps_avx(auVar14,auVar275,0x30);
  _local_468 = vshufps_avx(auVar275,auVar14,0x29);
  auVar14 = vsubps_avx(auVar275,auVar179);
  auVar20 = vsubps_avx(_local_468,local_f8);
  fVar217 = auVar20._0_4_ + auVar14._0_4_;
  fVar167 = auVar20._4_4_ + auVar14._4_4_;
  fVar218 = auVar20._8_4_ + auVar14._8_4_;
  fVar168 = auVar20._12_4_ + auVar14._12_4_;
  fVar219 = auVar20._16_4_ + auVar14._16_4_;
  fVar169 = auVar20._20_4_ + auVar14._20_4_;
  fVar220 = auVar20._24_4_ + auVar14._24_4_;
  auVar28._4_4_ = fVar201 * auVar179._4_4_;
  auVar28._0_4_ = fVar137 * auVar179._0_4_;
  auVar28._8_4_ = fVar164 * auVar179._8_4_;
  auVar28._12_4_ = fVar215 * auVar179._12_4_;
  auVar28._16_4_ = fVar165 * auVar179._16_4_;
  auVar28._20_4_ = fVar216 * auVar179._20_4_;
  auVar28._24_4_ = fVar166 * auVar179._24_4_;
  auVar28._28_4_ = auVar14._28_4_;
  auVar29._4_4_ = fVar167 * local_d8._4_4_;
  auVar29._0_4_ = fVar217 * local_d8._0_4_;
  auVar29._8_4_ = fVar218 * local_d8._8_4_;
  auVar29._12_4_ = fVar168 * local_d8._12_4_;
  auVar29._16_4_ = fVar219 * local_d8._16_4_;
  auVar29._20_4_ = fVar169 * local_d8._20_4_;
  auVar29._24_4_ = fVar220 * local_d8._24_4_;
  auVar29._28_4_ = fVar312;
  auVar21 = vsubps_avx(auVar28,auVar29);
  local_118 = local_d8._0_4_ + local_118;
  fStack_114 = local_d8._4_4_ + fStack_114;
  fStack_110 = local_d8._8_4_ + fStack_110;
  fStack_10c = local_d8._12_4_ + fStack_10c;
  fStack_108 = local_d8._16_4_ + fStack_108;
  fStack_104 = local_d8._20_4_ + fStack_104;
  fStack_100 = local_d8._24_4_ + fStack_100;
  fStack_fc = local_d8._28_4_ + auVar16._28_4_;
  local_138 = local_138 + auVar179._0_4_;
  fStack_134 = fStack_134 + auVar179._4_4_;
  fStack_130 = fStack_130 + auVar179._8_4_;
  fStack_12c = fStack_12c + auVar179._12_4_;
  fStack_128 = fStack_128 + auVar179._16_4_;
  fStack_124 = fStack_124 + auVar179._20_4_;
  fStack_120 = fStack_120 + auVar179._24_4_;
  fStack_11c = fVar315 + auVar179._28_4_;
  auVar30._4_4_ = fVar201 * fStack_134;
  auVar30._0_4_ = fVar137 * local_138;
  auVar30._8_4_ = fVar164 * fStack_130;
  auVar30._12_4_ = fVar215 * fStack_12c;
  auVar30._16_4_ = fVar165 * fStack_128;
  auVar30._20_4_ = fVar216 * fStack_124;
  auVar30._24_4_ = fVar166 * fStack_120;
  auVar30._28_4_ = fVar315;
  auVar31._4_4_ = fVar167 * fStack_114;
  auVar31._0_4_ = fVar217 * local_118;
  auVar31._8_4_ = fVar218 * fStack_110;
  auVar31._12_4_ = fVar168 * fStack_10c;
  auVar31._16_4_ = fVar219 * fStack_108;
  auVar31._20_4_ = fVar169 * fStack_104;
  auVar31._24_4_ = fVar220 * fStack_100;
  auVar31._28_4_ = fVar315 + auVar179._28_4_;
  auVar16 = vsubps_avx(auVar30,auVar31);
  auVar32._4_4_ = fVar201 * (float)local_4c8._4_4_;
  auVar32._0_4_ = fVar137 * (float)local_4c8._0_4_;
  auVar32._8_4_ = fVar164 * fStack_4c0;
  auVar32._12_4_ = fVar215 * fStack_4bc;
  auVar32._16_4_ = fVar165 * fStack_4b8;
  auVar32._20_4_ = fVar216 * fStack_4b4;
  auVar32._24_4_ = fVar166 * fStack_4b0;
  auVar32._28_4_ = fVar315;
  local_4a8._0_4_ = auVar94._0_4_;
  local_4a8._4_4_ = auVar94._4_4_;
  fStack_4a0 = auVar94._8_4_;
  fStack_49c = auVar94._12_4_;
  fStack_498 = auVar94._16_4_;
  fStack_494 = auVar94._20_4_;
  fStack_490 = auVar94._24_4_;
  auVar33._4_4_ = fVar167 * (float)local_4a8._4_4_;
  auVar33._0_4_ = fVar217 * (float)local_4a8._0_4_;
  auVar33._8_4_ = fVar218 * fStack_4a0;
  auVar33._12_4_ = fVar168 * fStack_49c;
  auVar33._16_4_ = fVar219 * fStack_498;
  auVar33._20_4_ = fVar169 * fStack_494;
  auVar33._24_4_ = fVar220 * fStack_490;
  auVar33._28_4_ = local_d8._28_4_;
  auVar22 = vsubps_avx(auVar32,auVar33);
  auVar34._4_4_ = local_f8._4_4_ * fVar201;
  auVar34._0_4_ = local_f8._0_4_ * fVar137;
  auVar34._8_4_ = local_f8._8_4_ * fVar164;
  auVar34._12_4_ = local_f8._12_4_ * fVar215;
  auVar34._16_4_ = local_f8._16_4_ * fVar165;
  auVar34._20_4_ = local_f8._20_4_ * fVar216;
  auVar34._24_4_ = local_f8._24_4_ * fVar166;
  auVar34._28_4_ = fVar315;
  auVar35._4_4_ = local_368._4_4_ * fVar167;
  auVar35._0_4_ = local_368._0_4_ * fVar217;
  auVar35._8_4_ = local_368._8_4_ * fVar218;
  auVar35._12_4_ = local_368._12_4_ * fVar168;
  auVar35._16_4_ = local_368._16_4_ * fVar219;
  auVar35._20_4_ = local_368._20_4_ * fVar169;
  auVar35._24_4_ = local_368._24_4_ * fVar220;
  auVar35._28_4_ = local_f8._28_4_;
  auVar23 = vsubps_avx(auVar34,auVar35);
  auVar36._4_4_ = auVar275._4_4_ * fVar201;
  auVar36._0_4_ = auVar275._0_4_ * fVar137;
  auVar36._8_4_ = auVar275._8_4_ * fVar164;
  auVar36._12_4_ = auVar275._12_4_ * fVar215;
  auVar36._16_4_ = auVar275._16_4_ * fVar165;
  auVar36._20_4_ = auVar275._20_4_ * fVar216;
  auVar36._24_4_ = auVar275._24_4_ * fVar166;
  auVar36._28_4_ = fVar315;
  auVar37._4_4_ = fVar167 * auVar249._4_4_;
  auVar37._0_4_ = fVar217 * auVar249._0_4_;
  auVar37._8_4_ = fVar218 * auVar249._8_4_;
  auVar37._12_4_ = fVar168 * auVar249._12_4_;
  auVar37._16_4_ = fVar219 * auVar249._16_4_;
  auVar37._20_4_ = fVar169 * auVar249._20_4_;
  auVar37._24_4_ = fVar220 * auVar249._24_4_;
  auVar37._28_4_ = fStack_fc;
  auVar95 = vsubps_avx(auVar36,auVar37);
  local_158 = auVar249._0_4_ + local_158;
  fStack_154 = auVar249._4_4_ + fStack_154;
  fStack_150 = auVar249._8_4_ + fStack_150;
  fStack_14c = auVar249._12_4_ + fStack_14c;
  fStack_148 = auVar249._16_4_ + fStack_148;
  fStack_144 = auVar249._20_4_ + fStack_144;
  fStack_140 = auVar249._24_4_ + fStack_140;
  fStack_13c = auVar249._28_4_ + auVar15._28_4_;
  local_178 = auVar275._0_4_ + local_178;
  fStack_174 = auVar275._4_4_ + fStack_174;
  fStack_170 = auVar275._8_4_ + fStack_170;
  fStack_16c = auVar275._12_4_ + fStack_16c;
  fStack_168 = auVar275._16_4_ + fStack_168;
  fStack_164 = auVar275._20_4_ + fStack_164;
  fStack_160 = auVar275._24_4_ + fStack_160;
  fStack_15c = auVar275._28_4_ + auVar214._28_4_;
  auVar38._4_4_ = fVar201 * fStack_174;
  auVar38._0_4_ = fVar137 * local_178;
  auVar38._8_4_ = fVar164 * fStack_170;
  auVar38._12_4_ = fVar215 * fStack_16c;
  auVar38._16_4_ = fVar165 * fStack_168;
  auVar38._20_4_ = fVar216 * fStack_164;
  auVar38._24_4_ = fVar166 * fStack_160;
  auVar38._28_4_ = auVar275._28_4_ + auVar214._28_4_;
  auVar39._4_4_ = fStack_154 * fVar167;
  auVar39._0_4_ = local_158 * fVar217;
  auVar39._8_4_ = fStack_150 * fVar218;
  auVar39._12_4_ = fStack_14c * fVar168;
  auVar39._16_4_ = fStack_148 * fVar219;
  auVar39._20_4_ = fStack_144 * fVar169;
  auVar39._24_4_ = fStack_140 * fVar220;
  auVar39._28_4_ = fStack_13c;
  auVar96 = vsubps_avx(auVar38,auVar39);
  auVar40._4_4_ = fVar201 * local_b8._4_4_;
  auVar40._0_4_ = fVar137 * local_b8._0_4_;
  auVar40._8_4_ = fVar164 * local_b8._8_4_;
  auVar40._12_4_ = fVar215 * local_b8._12_4_;
  auVar40._16_4_ = fVar165 * local_b8._16_4_;
  auVar40._20_4_ = fVar216 * local_b8._20_4_;
  auVar40._24_4_ = fVar166 * local_b8._24_4_;
  auVar40._28_4_ = fStack_13c;
  auVar41._4_4_ = fVar167 * (float)local_248._4_4_;
  auVar41._0_4_ = fVar217 * (float)local_248._0_4_;
  auVar41._8_4_ = fVar218 * fStack_240;
  auVar41._12_4_ = fVar168 * fStack_23c;
  auVar41._16_4_ = fVar219 * fStack_238;
  auVar41._20_4_ = fVar169 * fStack_234;
  auVar41._24_4_ = fVar220 * fStack_230;
  auVar41._28_4_ = local_b8._28_4_;
  auVar97 = vsubps_avx(auVar40,auVar41);
  auVar42._4_4_ = fVar201 * local_468._4_4_;
  auVar42._0_4_ = fVar137 * local_468._0_4_;
  auVar42._8_4_ = fVar164 * local_468._8_4_;
  auVar42._12_4_ = fVar215 * local_468._12_4_;
  auVar42._16_4_ = fVar165 * local_468._16_4_;
  auVar42._20_4_ = fVar216 * local_468._20_4_;
  auVar42._24_4_ = fVar166 * local_468._24_4_;
  auVar42._28_4_ = auVar19._28_4_ + auVar17._28_4_;
  auVar43._4_4_ = auVar18._4_4_ * fVar167;
  auVar43._0_4_ = auVar18._0_4_ * fVar217;
  auVar43._8_4_ = auVar18._8_4_ * fVar218;
  auVar43._12_4_ = auVar18._12_4_ * fVar168;
  auVar43._16_4_ = auVar18._16_4_ * fVar219;
  auVar43._20_4_ = auVar18._20_4_ * fVar169;
  auVar43._24_4_ = auVar18._24_4_ * fVar220;
  auVar43._28_4_ = auVar20._28_4_ + auVar14._28_4_;
  auVar19 = vsubps_avx(auVar42,auVar43);
  auVar14 = vminps_avx(auVar21,auVar16);
  auVar94 = vmaxps_avx(auVar21,auVar16);
  auVar15 = vminps_avx(auVar22,auVar23);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar22,auVar23);
  auVar94 = vmaxps_avx(auVar94,auVar14);
  auVar16 = vminps_avx(auVar95,auVar96);
  auVar14 = vmaxps_avx(auVar95,auVar96);
  auVar17 = vminps_avx(auVar97,auVar19);
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar17 = vminps_avx(auVar15,auVar17);
  auVar15 = vmaxps_avx(auVar97,auVar19);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar94,auVar14);
  auVar94 = vcmpps_avx(auVar17,local_78,2);
  auVar14 = vcmpps_avx(auVar14,local_98,5);
  auVar94 = vandps_avx(auVar14,auVar94);
  auVar14 = local_198 & auVar94;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(local_368,local_d8);
    auVar15 = vsubps_avx(auVar18,auVar249);
    fVar201 = auVar14._0_4_ + auVar15._0_4_;
    fVar164 = auVar14._4_4_ + auVar15._4_4_;
    fVar215 = auVar14._8_4_ + auVar15._8_4_;
    fVar165 = auVar14._12_4_ + auVar15._12_4_;
    fVar216 = auVar14._16_4_ + auVar15._16_4_;
    fVar166 = auVar14._20_4_ + auVar15._20_4_;
    fVar217 = auVar14._24_4_ + auVar15._24_4_;
    auVar17 = vsubps_avx(local_f8,auVar179);
    auVar19 = vsubps_avx(_local_468,auVar275);
    fVar167 = auVar17._0_4_ + auVar19._0_4_;
    fVar218 = auVar17._4_4_ + auVar19._4_4_;
    fVar168 = auVar17._8_4_ + auVar19._8_4_;
    fVar219 = auVar17._12_4_ + auVar19._12_4_;
    fVar169 = auVar17._16_4_ + auVar19._16_4_;
    fVar220 = auVar17._20_4_ + auVar19._20_4_;
    fVar221 = auVar17._24_4_ + auVar19._24_4_;
    fVar137 = auVar19._28_4_;
    auVar44._4_4_ = auVar179._4_4_ * fVar164;
    auVar44._0_4_ = auVar179._0_4_ * fVar201;
    auVar44._8_4_ = auVar179._8_4_ * fVar215;
    auVar44._12_4_ = auVar179._12_4_ * fVar165;
    auVar44._16_4_ = auVar179._16_4_ * fVar216;
    auVar44._20_4_ = auVar179._20_4_ * fVar166;
    auVar44._24_4_ = auVar179._24_4_ * fVar217;
    auVar44._28_4_ = auVar179._28_4_;
    auVar45._4_4_ = local_d8._4_4_ * fVar218;
    auVar45._0_4_ = local_d8._0_4_ * fVar167;
    auVar45._8_4_ = local_d8._8_4_ * fVar168;
    auVar45._12_4_ = local_d8._12_4_ * fVar219;
    auVar45._16_4_ = local_d8._16_4_ * fVar169;
    auVar45._20_4_ = local_d8._20_4_ * fVar220;
    auVar45._24_4_ = local_d8._24_4_ * fVar221;
    auVar45._28_4_ = local_d8._28_4_;
    auVar19 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar164 * fStack_134;
    auVar46._0_4_ = fVar201 * local_138;
    auVar46._8_4_ = fVar215 * fStack_130;
    auVar46._12_4_ = fVar165 * fStack_12c;
    auVar46._16_4_ = fVar216 * fStack_128;
    auVar46._20_4_ = fVar166 * fStack_124;
    auVar46._24_4_ = fVar217 * fStack_120;
    auVar46._28_4_ = auVar179._28_4_;
    auVar47._4_4_ = fVar218 * fStack_114;
    auVar47._0_4_ = fVar167 * local_118;
    auVar47._8_4_ = fVar168 * fStack_110;
    auVar47._12_4_ = fVar219 * fStack_10c;
    auVar47._16_4_ = fVar169 * fStack_108;
    auVar47._20_4_ = fVar220 * fStack_104;
    auVar47._24_4_ = fVar221 * fStack_100;
    auVar47._28_4_ = fVar137;
    auVar20 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = fVar164 * (float)local_4c8._4_4_;
    auVar48._0_4_ = fVar201 * (float)local_4c8._0_4_;
    auVar48._8_4_ = fVar215 * fStack_4c0;
    auVar48._12_4_ = fVar165 * fStack_4bc;
    auVar48._16_4_ = fVar216 * fStack_4b8;
    auVar48._20_4_ = fVar166 * fStack_4b4;
    auVar48._24_4_ = fVar217 * fStack_4b0;
    auVar48._28_4_ = fVar137;
    auVar49._4_4_ = fVar218 * (float)local_4a8._4_4_;
    auVar49._0_4_ = fVar167 * (float)local_4a8._0_4_;
    auVar49._8_4_ = fVar168 * fStack_4a0;
    auVar49._12_4_ = fVar219 * fStack_49c;
    auVar49._16_4_ = fVar169 * fStack_498;
    auVar49._20_4_ = fVar220 * fStack_494;
    auVar49._24_4_ = fVar221 * fStack_490;
    auVar49._28_4_ = auVar16._28_4_;
    auVar21 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = local_f8._4_4_ * fVar164;
    auVar50._0_4_ = local_f8._0_4_ * fVar201;
    auVar50._8_4_ = local_f8._8_4_ * fVar215;
    auVar50._12_4_ = local_f8._12_4_ * fVar165;
    auVar50._16_4_ = local_f8._16_4_ * fVar216;
    auVar50._20_4_ = local_f8._20_4_ * fVar166;
    auVar50._24_4_ = local_f8._24_4_ * fVar217;
    auVar50._28_4_ = auVar16._28_4_;
    auVar51._4_4_ = local_368._4_4_ * fVar218;
    auVar51._0_4_ = local_368._0_4_ * fVar167;
    auVar51._8_4_ = local_368._8_4_ * fVar168;
    auVar51._12_4_ = local_368._12_4_ * fVar219;
    auVar51._16_4_ = local_368._16_4_ * fVar169;
    auVar51._20_4_ = local_368._20_4_ * fVar220;
    uVar73 = local_368._28_4_;
    auVar51._24_4_ = local_368._24_4_ * fVar221;
    auVar51._28_4_ = uVar73;
    auVar22 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar275._4_4_ * fVar164;
    auVar52._0_4_ = auVar275._0_4_ * fVar201;
    auVar52._8_4_ = auVar275._8_4_ * fVar215;
    auVar52._12_4_ = auVar275._12_4_ * fVar165;
    auVar52._16_4_ = auVar275._16_4_ * fVar216;
    auVar52._20_4_ = auVar275._20_4_ * fVar166;
    auVar52._24_4_ = auVar275._24_4_ * fVar217;
    auVar52._28_4_ = uVar73;
    auVar53._4_4_ = auVar249._4_4_ * fVar218;
    auVar53._0_4_ = auVar249._0_4_ * fVar167;
    auVar53._8_4_ = auVar249._8_4_ * fVar168;
    auVar53._12_4_ = auVar249._12_4_ * fVar219;
    auVar53._16_4_ = auVar249._16_4_ * fVar169;
    auVar53._20_4_ = auVar249._20_4_ * fVar220;
    auVar53._24_4_ = auVar249._24_4_ * fVar221;
    auVar53._28_4_ = auVar249._28_4_;
    auVar23 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = fVar164 * fStack_174;
    auVar54._0_4_ = fVar201 * local_178;
    auVar54._8_4_ = fVar215 * fStack_170;
    auVar54._12_4_ = fVar165 * fStack_16c;
    auVar54._16_4_ = fVar216 * fStack_168;
    auVar54._20_4_ = fVar166 * fStack_164;
    auVar54._24_4_ = fVar217 * fStack_160;
    auVar54._28_4_ = uVar73;
    auVar55._4_4_ = fVar218 * fStack_154;
    auVar55._0_4_ = fVar167 * local_158;
    auVar55._8_4_ = fVar168 * fStack_150;
    auVar55._12_4_ = fVar219 * fStack_14c;
    auVar55._16_4_ = fVar169 * fStack_148;
    auVar55._20_4_ = fVar220 * fStack_144;
    auVar55._24_4_ = fVar221 * fStack_140;
    auVar55._28_4_ = auVar275._28_4_;
    auVar95 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar164 * local_b8._4_4_;
    auVar56._0_4_ = fVar201 * local_b8._0_4_;
    auVar56._8_4_ = fVar215 * local_b8._8_4_;
    auVar56._12_4_ = fVar165 * local_b8._12_4_;
    auVar56._16_4_ = fVar216 * local_b8._16_4_;
    auVar56._20_4_ = fVar166 * local_b8._20_4_;
    auVar56._24_4_ = fVar217 * local_b8._24_4_;
    auVar56._28_4_ = auVar275._28_4_;
    auVar57._4_4_ = (float)local_248._4_4_ * fVar218;
    auVar57._0_4_ = (float)local_248._0_4_ * fVar167;
    auVar57._8_4_ = fStack_240 * fVar168;
    auVar57._12_4_ = fStack_23c * fVar219;
    auVar57._16_4_ = fStack_238 * fVar169;
    auVar57._20_4_ = fStack_234 * fVar220;
    auVar57._24_4_ = fStack_230 * fVar221;
    auVar57._28_4_ = local_f8._28_4_;
    auVar96 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = fVar164 * local_468._4_4_;
    auVar58._0_4_ = fVar201 * local_468._0_4_;
    auVar58._8_4_ = fVar215 * local_468._8_4_;
    auVar58._12_4_ = fVar165 * local_468._12_4_;
    auVar58._16_4_ = fVar216 * local_468._16_4_;
    auVar58._20_4_ = fVar166 * local_468._20_4_;
    auVar58._24_4_ = fVar217 * local_468._24_4_;
    auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
    auVar59._4_4_ = auVar18._4_4_ * fVar218;
    auVar59._0_4_ = auVar18._0_4_ * fVar167;
    auVar59._8_4_ = auVar18._8_4_ * fVar168;
    auVar59._12_4_ = auVar18._12_4_ * fVar219;
    auVar59._16_4_ = auVar18._16_4_ * fVar169;
    auVar59._20_4_ = auVar18._20_4_ * fVar220;
    auVar59._24_4_ = auVar18._24_4_ * fVar221;
    auVar59._28_4_ = auVar17._28_4_ + fVar137;
    auVar97 = vsubps_avx(auVar58,auVar59);
    auVar15 = vminps_avx(auVar19,auVar20);
    auVar14 = vmaxps_avx(auVar19,auVar20);
    auVar16 = vminps_avx(auVar21,auVar22);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar21,auVar22);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar17 = vminps_avx(auVar23,auVar95);
    auVar15 = vmaxps_avx(auVar23,auVar95);
    auVar18 = vminps_avx(auVar96,auVar97);
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar96,auVar97);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vcmpps_avx(auVar17,local_78,2);
    auVar15 = vcmpps_avx(auVar15,local_98,5);
    auVar14 = vandps_avx(auVar15,auVar14);
    auVar94 = vandps_avx(local_198,auVar94);
    auVar15 = auVar94 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar94 = vandps_avx(auVar14,auVar94);
      uVar66 = vmovmskps_avx(auVar94);
      if (uVar66 != 0) {
        _local_248 = auVar98;
        auStack_2c8[uVar72] = uVar66 & 0xff;
        uVar2 = vmovlps_avx(_local_4f8);
        *(undefined8 *)(afStack_1d8 + uVar72 * 2) = uVar2;
        uVar3 = vmovlps_avx(auVar256);
        auStack_58[uVar72] = uVar3;
        uVar72 = (ulong)((int)uVar72 + 1);
        auVar98 = _local_248;
      }
    }
  }
LAB_009c4984:
  do {
    do {
      do {
        do {
          _local_248 = auVar98;
          if ((int)uVar72 == 0) {
            if (bVar74) goto LAB_009c58fc;
            fVar137 = ray->tfar;
            auVar104._4_4_ = fVar137;
            auVar104._0_4_ = fVar137;
            auVar104._8_4_ = fVar137;
            auVar104._12_4_ = fVar137;
            auVar104._16_4_ = fVar137;
            auVar104._20_4_ = fVar137;
            auVar104._24_4_ = fVar137;
            auVar104._28_4_ = fVar137;
            auVar94 = vcmpps_avx(local_1b8,auVar104,2);
            uVar66 = vmovmskps_avx(auVar94);
            uVar67 = (ulong)((uint)uVar71 & uVar66);
            goto LAB_009c3b3a;
          }
          uVar69 = (int)uVar72 - 1;
          uVar70 = (ulong)uVar69;
          uVar66 = auStack_2c8[uVar70];
          fVar137 = afStack_1d8[uVar70 * 2];
          fVar201 = afStack_1d8[uVar70 * 2 + 1];
          auVar317._8_8_ = 0;
          auVar317._0_8_ = auStack_58[uVar70];
          auVar320 = ZEXT1664(auVar317);
          uVar3 = 0;
          if (uVar66 != 0) {
            for (; (uVar66 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar66 = uVar66 - 1 & uVar66;
          auStack_2c8[uVar70] = uVar66;
          if (uVar66 == 0) {
            uVar72 = (ulong)uVar69;
          }
          auVar231 = ZEXT1664(local_378);
          auVar250 = ZEXT1664(local_388);
          auVar331 = ZEXT1664(local_398);
          auVar264 = ZEXT1664(local_3a8);
          auVar294 = ZEXT1664(local_3b8);
          auVar276 = ZEXT1664(local_3c8);
          auVar302 = ZEXT1664(local_3d8);
          auVar308 = ZEXT1664(local_3e8);
          fVar215 = (float)(uVar3 + 1) * 0.14285715;
          fVar164 = (1.0 - (float)uVar3 * 0.14285715) * fVar137 +
                    fVar201 * (float)uVar3 * 0.14285715;
          fVar137 = (1.0 - fVar215) * fVar137 + fVar201 * fVar215;
          fVar201 = fVar137 - fVar164;
          if (0.16666667 <= fVar201) {
            _local_4f8 = vinsertps_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar137),0x10);
            goto LAB_009c432a;
          }
          auVar83 = vshufps_avx(auVar317,auVar317,0x50);
          auVar110._8_4_ = 0x3f800000;
          auVar110._0_8_ = 0x3f8000003f800000;
          auVar110._12_4_ = 0x3f800000;
          auVar255 = vsubps_avx(auVar110,auVar83);
          fVar215 = auVar83._0_4_;
          fVar165 = auVar83._4_4_;
          fVar216 = auVar83._8_4_;
          fVar166 = auVar83._12_4_;
          fVar217 = auVar255._0_4_;
          fVar167 = auVar255._4_4_;
          fVar218 = auVar255._8_4_;
          fVar168 = auVar255._12_4_;
          auVar140._0_4_ = local_3b8._0_4_ * fVar215 + fVar217 * local_378._0_4_;
          auVar140._4_4_ = local_3b8._4_4_ * fVar165 + fVar167 * local_378._4_4_;
          auVar140._8_4_ = local_3b8._8_4_ * fVar216 + fVar218 * local_378._8_4_;
          auVar140._12_4_ = local_3b8._12_4_ * fVar166 + fVar168 * local_378._12_4_;
          auVar186._0_4_ = local_3c8._0_4_ * fVar215 + fVar217 * local_388._0_4_;
          auVar186._4_4_ = local_3c8._4_4_ * fVar165 + fVar167 * local_388._4_4_;
          auVar186._8_4_ = local_3c8._8_4_ * fVar216 + fVar218 * local_388._8_4_;
          auVar186._12_4_ = local_3c8._12_4_ * fVar166 + fVar168 * local_388._12_4_;
          auVar206._0_4_ = local_3d8._0_4_ * fVar215 + local_398._0_4_ * fVar217;
          auVar206._4_4_ = local_3d8._4_4_ * fVar165 + local_398._4_4_ * fVar167;
          auVar206._8_4_ = local_3d8._8_4_ * fVar216 + local_398._8_4_ * fVar218;
          auVar206._12_4_ = local_3d8._12_4_ * fVar166 + local_398._12_4_ * fVar168;
          auVar80._0_4_ = local_3e8._0_4_ * fVar215 + local_3a8._0_4_ * fVar217;
          auVar80._4_4_ = local_3e8._4_4_ * fVar165 + local_3a8._4_4_ * fVar167;
          auVar80._8_4_ = local_3e8._8_4_ * fVar216 + local_3a8._8_4_ * fVar218;
          auVar80._12_4_ = local_3e8._12_4_ * fVar166 + local_3a8._12_4_ * fVar168;
          auVar134._16_16_ = auVar140;
          auVar134._0_16_ = auVar140;
          auVar162._16_16_ = auVar186;
          auVar162._0_16_ = auVar186;
          auVar200._16_16_ = auVar206;
          auVar200._0_16_ = auVar206;
          _local_4a8 = ZEXT432((uint)fVar164);
          _local_4c8 = ZEXT416((uint)fVar137);
          auVar94 = ZEXT2032(CONCAT416(fVar137,ZEXT416((uint)fVar164)));
          auVar94 = vshufps_avx(auVar94,auVar94,0);
          auVar14 = vsubps_avx(auVar162,auVar134);
          fVar215 = auVar94._0_4_;
          fVar165 = auVar94._4_4_;
          fVar216 = auVar94._8_4_;
          fVar166 = auVar94._12_4_;
          fVar217 = auVar94._16_4_;
          fVar167 = auVar94._20_4_;
          fVar218 = auVar94._24_4_;
          auVar135._0_4_ = auVar140._0_4_ + auVar14._0_4_ * fVar215;
          auVar135._4_4_ = auVar140._4_4_ + auVar14._4_4_ * fVar165;
          auVar135._8_4_ = auVar140._8_4_ + auVar14._8_4_ * fVar216;
          auVar135._12_4_ = auVar140._12_4_ + auVar14._12_4_ * fVar166;
          auVar135._16_4_ = auVar140._0_4_ + auVar14._16_4_ * fVar217;
          auVar135._20_4_ = auVar140._4_4_ + auVar14._20_4_ * fVar167;
          auVar135._24_4_ = auVar140._8_4_ + auVar14._24_4_ * fVar218;
          auVar135._28_4_ = auVar140._12_4_ + auVar14._28_4_;
          auVar94 = vsubps_avx(auVar200,auVar162);
          auVar163._0_4_ = auVar186._0_4_ + auVar94._0_4_ * fVar215;
          auVar163._4_4_ = auVar186._4_4_ + auVar94._4_4_ * fVar165;
          auVar163._8_4_ = auVar186._8_4_ + auVar94._8_4_ * fVar216;
          auVar163._12_4_ = auVar186._12_4_ + auVar94._12_4_ * fVar166;
          auVar163._16_4_ = auVar186._0_4_ + auVar94._16_4_ * fVar217;
          auVar163._20_4_ = auVar186._4_4_ + auVar94._20_4_ * fVar167;
          auVar163._24_4_ = auVar186._8_4_ + auVar94._24_4_ * fVar218;
          auVar163._28_4_ = auVar186._12_4_ + auVar94._28_4_;
          auVar83 = vsubps_avx(auVar80,auVar206);
          auVar102._0_4_ = auVar206._0_4_ + auVar83._0_4_ * fVar215;
          auVar102._4_4_ = auVar206._4_4_ + auVar83._4_4_ * fVar165;
          auVar102._8_4_ = auVar206._8_4_ + auVar83._8_4_ * fVar216;
          auVar102._12_4_ = auVar206._12_4_ + auVar83._12_4_ * fVar166;
          auVar102._16_4_ = auVar206._0_4_ + auVar83._0_4_ * fVar217;
          auVar102._20_4_ = auVar206._4_4_ + auVar83._4_4_ * fVar167;
          auVar102._24_4_ = auVar206._8_4_ + auVar83._8_4_ * fVar218;
          auVar102._28_4_ = auVar206._12_4_ + auVar83._12_4_;
          auVar94 = vsubps_avx(auVar163,auVar135);
          auVar136._0_4_ = auVar135._0_4_ + fVar215 * auVar94._0_4_;
          auVar136._4_4_ = auVar135._4_4_ + fVar165 * auVar94._4_4_;
          auVar136._8_4_ = auVar135._8_4_ + fVar216 * auVar94._8_4_;
          auVar136._12_4_ = auVar135._12_4_ + fVar166 * auVar94._12_4_;
          auVar136._16_4_ = auVar135._16_4_ + fVar217 * auVar94._16_4_;
          auVar136._20_4_ = auVar135._20_4_ + fVar167 * auVar94._20_4_;
          auVar136._24_4_ = auVar135._24_4_ + fVar218 * auVar94._24_4_;
          auVar136._28_4_ = auVar135._28_4_ + auVar94._28_4_;
          auVar94 = vsubps_avx(auVar102,auVar163);
          auVar103._0_4_ = auVar163._0_4_ + fVar215 * auVar94._0_4_;
          auVar103._4_4_ = auVar163._4_4_ + fVar165 * auVar94._4_4_;
          auVar103._8_4_ = auVar163._8_4_ + fVar216 * auVar94._8_4_;
          auVar103._12_4_ = auVar163._12_4_ + fVar166 * auVar94._12_4_;
          auVar103._16_4_ = auVar163._16_4_ + fVar217 * auVar94._16_4_;
          auVar103._20_4_ = auVar163._20_4_ + fVar167 * auVar94._20_4_;
          auVar103._24_4_ = auVar163._24_4_ + fVar218 * auVar94._24_4_;
          auVar103._28_4_ = auVar163._28_4_ + auVar94._28_4_;
          auVar94 = vsubps_avx(auVar103,auVar136);
          auVar228._0_4_ = auVar136._0_4_ + fVar215 * auVar94._0_4_;
          auVar228._4_4_ = auVar136._4_4_ + fVar165 * auVar94._4_4_;
          auVar228._8_4_ = auVar136._8_4_ + fVar216 * auVar94._8_4_;
          auVar228._12_4_ = auVar136._12_4_ + fVar166 * auVar94._12_4_;
          auVar230._16_4_ = auVar136._16_4_ + fVar217 * auVar94._16_4_;
          auVar230._0_16_ = auVar228;
          auVar230._20_4_ = auVar136._20_4_ + fVar167 * auVar94._20_4_;
          auVar230._24_4_ = auVar136._24_4_ + fVar218 * auVar94._24_4_;
          auVar230._28_4_ = auVar136._28_4_ + auVar163._28_4_;
          auVar236 = auVar230._16_16_;
          auVar112 = vshufps_avx(ZEXT416((uint)(fVar201 * 0.33333334)),
                                 ZEXT416((uint)(fVar201 * 0.33333334)),0);
          auVar187._0_4_ = auVar228._0_4_ + auVar112._0_4_ * auVar94._0_4_ * 3.0;
          auVar187._4_4_ = auVar228._4_4_ + auVar112._4_4_ * auVar94._4_4_ * 3.0;
          auVar187._8_4_ = auVar228._8_4_ + auVar112._8_4_ * auVar94._8_4_ * 3.0;
          auVar187._12_4_ = auVar228._12_4_ + auVar112._12_4_ * auVar94._12_4_ * 3.0;
          auVar156 = vshufpd_avx(auVar228,auVar228,3);
          auVar124 = vshufpd_avx(auVar236,auVar236,3);
          _local_468 = auVar156;
          auVar83 = vsubps_avx(auVar156,auVar228);
          auVar255 = vsubps_avx(auVar124,auVar236);
          auVar81._0_4_ = auVar83._0_4_ + auVar255._0_4_;
          auVar81._4_4_ = auVar83._4_4_ + auVar255._4_4_;
          auVar81._8_4_ = auVar83._8_4_ + auVar255._8_4_;
          auVar81._12_4_ = auVar83._12_4_ + auVar255._12_4_;
          auVar83 = vmovshdup_avx(auVar228);
          auVar255 = vmovshdup_avx(auVar187);
          auVar142 = vshufps_avx(auVar81,auVar81,0);
          auVar113 = vshufps_avx(auVar81,auVar81,0x55);
          fVar215 = auVar113._0_4_;
          fVar165 = auVar113._4_4_;
          fVar216 = auVar113._8_4_;
          fVar166 = auVar113._12_4_;
          fVar217 = auVar142._0_4_;
          fVar167 = auVar142._4_4_;
          fVar218 = auVar142._8_4_;
          fVar168 = auVar142._12_4_;
          auVar82._0_4_ = fVar217 * auVar228._0_4_ + auVar83._0_4_ * fVar215;
          auVar82._4_4_ = fVar167 * auVar228._4_4_ + auVar83._4_4_ * fVar165;
          auVar82._8_4_ = fVar218 * auVar228._8_4_ + auVar83._8_4_ * fVar216;
          auVar82._12_4_ = fVar168 * auVar228._12_4_ + auVar83._12_4_ * fVar166;
          local_368._0_16_ = auVar187;
          auVar296._0_4_ = fVar217 * auVar187._0_4_ + auVar255._0_4_ * fVar215;
          auVar296._4_4_ = fVar167 * auVar187._4_4_ + auVar255._4_4_ * fVar165;
          auVar296._8_4_ = fVar218 * auVar187._8_4_ + auVar255._8_4_ * fVar216;
          auVar296._12_4_ = fVar168 * auVar187._12_4_ + auVar255._12_4_ * fVar166;
          auVar255 = vshufps_avx(auVar82,auVar82,0xe8);
          auVar142 = vshufps_avx(auVar296,auVar296,0xe8);
          auVar83 = vcmpps_avx(auVar255,auVar142,1);
          uVar66 = vextractps_avx(auVar83,0);
          auVar113 = auVar296;
          if ((uVar66 & 1) == 0) {
            auVar113 = auVar82;
          }
          auVar111._0_4_ = auVar112._0_4_ * auVar94._16_4_ * 3.0;
          auVar111._4_4_ = auVar112._4_4_ * auVar94._20_4_ * 3.0;
          auVar111._8_4_ = auVar112._8_4_ * auVar94._24_4_ * 3.0;
          auVar111._12_4_ = auVar112._12_4_ * 0.0;
          auVar6 = vsubps_avx(auVar236,auVar111);
          auVar112 = vmovshdup_avx(auVar6);
          auVar236 = vmovshdup_avx(auVar236);
          fVar219 = auVar6._0_4_;
          fVar169 = auVar6._4_4_;
          auVar207._0_4_ = fVar219 * fVar217 + auVar112._0_4_ * fVar215;
          auVar207._4_4_ = fVar169 * fVar167 + auVar112._4_4_ * fVar165;
          auVar207._8_4_ = auVar6._8_4_ * fVar218 + auVar112._8_4_ * fVar216;
          auVar207._12_4_ = auVar6._12_4_ * fVar168 + auVar112._12_4_ * fVar166;
          auVar329._0_4_ = fVar217 * auVar230._16_4_ + auVar236._0_4_ * fVar215;
          auVar329._4_4_ = fVar167 * auVar230._20_4_ + auVar236._4_4_ * fVar165;
          auVar329._8_4_ = fVar218 * auVar230._24_4_ + auVar236._8_4_ * fVar216;
          auVar329._12_4_ = fVar168 * auVar230._28_4_ + auVar236._12_4_ * fVar166;
          auVar236 = vshufps_avx(auVar207,auVar207,0xe8);
          auVar5 = vshufps_avx(auVar329,auVar329,0xe8);
          auVar112 = vcmpps_avx(auVar236,auVar5,1);
          uVar66 = vextractps_avx(auVar112,0);
          auVar256 = auVar329;
          if ((uVar66 & 1) == 0) {
            auVar256 = auVar207;
          }
          auVar113 = vmaxss_avx(auVar256,auVar113);
          auVar255 = vminps_avx(auVar255,auVar142);
          auVar142 = vminps_avx(auVar236,auVar5);
          auVar142 = vminps_avx(auVar255,auVar142);
          auVar83 = vshufps_avx(auVar83,auVar83,0x55);
          auVar83 = vblendps_avx(auVar83,auVar112,2);
          auVar112 = vpslld_avx(auVar83,0x1f);
          auVar83 = vshufpd_avx(auVar296,auVar296,1);
          auVar83 = vinsertps_avx(auVar83,auVar329,0x9c);
          auVar255 = vshufpd_avx(auVar82,auVar82,1);
          auVar255 = vinsertps_avx(auVar255,auVar207,0x9c);
          auVar83 = vblendvps_avx(auVar255,auVar83,auVar112);
          auVar255 = vmovshdup_avx(auVar83);
          auVar83 = vmaxss_avx(auVar255,auVar83);
          fVar216 = auVar142._0_4_;
          auVar255 = vmovshdup_avx(auVar142);
          fVar165 = auVar83._0_4_;
          fVar166 = auVar255._0_4_;
          fVar215 = auVar113._0_4_;
          auVar98 = _local_248;
          if ((fVar216 < 0.0001) && (-0.0001 < fVar165)) break;
          if ((fVar166 < 0.0001 && -0.0001 < fVar215) || (fVar216 < 0.0001 && -0.0001 < fVar215))
          break;
          auVar112 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar83,1);
          auVar255 = vcmpps_avx(auVar255,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar255 = vandps_avx(auVar255,auVar112);
        } while ((auVar255 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar112 = vcmpps_avx(auVar142,_DAT_01f45a50,1);
        auVar255 = vcmpss_avx(auVar113,ZEXT416(0) << 0x20,1);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar188._8_4_ = 0xbf800000;
        auVar188._0_8_ = 0xbf800000bf800000;
        auVar188._12_4_ = 0xbf800000;
        auVar255 = vblendvps_avx(auVar141,auVar188,auVar255);
        auVar112 = vblendvps_avx(auVar141,auVar188,auVar112);
        auVar142 = vcmpss_avx(auVar112,auVar255,4);
        auVar142 = vpshufd_avx(ZEXT416(auVar142._0_4_ & 1),0x50);
        auVar142 = vpslld_avx(auVar142,0x1f);
        auVar142 = vpsrad_avx(auVar142,0x1f);
        auVar142 = vpandn_avx(auVar142,_DAT_01f7afb0);
        auVar113 = vmovshdup_avx(auVar112);
        fVar217 = auVar113._0_4_;
        if ((auVar112._0_4_ != fVar217) || (NAN(auVar112._0_4_) || NAN(fVar217))) {
          if ((fVar166 != fVar216) || (NAN(fVar166) || NAN(fVar216))) {
            fVar216 = -fVar216 / (fVar166 - fVar216);
            auVar112 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar216) * 0.0 + fVar216)));
          }
          else {
            auVar112 = ZEXT816(0x3f80000000000000);
            if ((fVar216 != 0.0) || (NAN(fVar216))) {
              auVar112 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar236 = vcmpps_avx(auVar142,auVar112,1);
          auVar113 = vblendps_avx(auVar142,auVar112,2);
          auVar112 = vblendps_avx(auVar112,auVar142,2);
          auVar142 = vblendvps_avx(auVar112,auVar113,auVar236);
        }
        auVar83 = vcmpss_avx(auVar83,ZEXT416(0) << 0x20,1);
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar189._8_4_ = 0xbf800000;
        auVar189._0_8_ = 0xbf800000bf800000;
        auVar189._12_4_ = 0xbf800000;
        auVar83 = vblendvps_avx(auVar143,auVar189,auVar83);
        fVar216 = auVar83._0_4_;
        if ((auVar255._0_4_ != fVar216) || (NAN(auVar255._0_4_) || NAN(fVar216))) {
          if ((fVar165 != fVar215) || (NAN(fVar165) || NAN(fVar215))) {
            fVar215 = -fVar215 / (fVar165 - fVar215);
            auVar83 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar215) * 0.0 + fVar215)));
          }
          else {
            auVar83 = ZEXT816(0x3f80000000000000);
            if ((fVar215 != 0.0) || (NAN(fVar215))) {
              auVar83 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar112 = vcmpps_avx(auVar142,auVar83,1);
          auVar255 = vblendps_avx(auVar142,auVar83,2);
          auVar83 = vblendps_avx(auVar83,auVar142,2);
          auVar142 = vblendvps_avx(auVar83,auVar255,auVar112);
        }
        if ((fVar217 != fVar216) || (NAN(fVar217) || NAN(fVar216))) {
          auVar84._8_4_ = 0x3f800000;
          auVar84._0_8_ = 0x3f8000003f800000;
          auVar84._12_4_ = 0x3f800000;
          auVar83 = vcmpps_avx(auVar142,auVar84,1);
          auVar255 = vinsertps_avx(auVar142,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar144._4_12_ = auVar142._4_12_;
          auVar144._0_4_ = 0x3f800000;
          auVar142 = vblendvps_avx(auVar144,auVar255,auVar83);
        }
        auVar83 = vcmpps_avx(auVar142,_DAT_01f46740,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar142._4_12_;
        auVar255 = vinsertps_avx(auVar142,ZEXT416(0x3f800000),0x10);
        auVar83 = vblendvps_avx(auVar255,auVar61 << 0x20,auVar83);
        auVar255 = vmovshdup_avx(auVar83);
      } while (auVar255._0_4_ < auVar83._0_4_);
      auVar85._0_4_ = auVar83._0_4_ + -0.1;
      auVar85._4_4_ = auVar83._4_4_ + 0.1;
      auVar85._8_4_ = auVar83._8_4_ + 0.0;
      auVar85._12_4_ = auVar83._12_4_ + 0.0;
      auVar112 = vshufpd_avx(auVar187,auVar187,3);
      local_368._8_8_ = 0x3f80000000000000;
      local_368._0_8_ = 0x3f80000000000000;
      auVar83 = vcmpps_avx(auVar85,local_368._0_16_,1);
      auVar60._12_4_ = 0;
      auVar60._0_12_ = auVar85._4_12_;
      auVar255 = vinsertps_avx(auVar85,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar83 = vblendvps_avx(auVar255,auVar60 << 0x20,auVar83);
      auVar255 = vshufpd_avx(auVar6,auVar6,3);
      auVar142 = vshufps_avx(auVar83,auVar83,0x50);
      auVar323._8_4_ = 0x3f800000;
      auVar323._0_8_ = 0x3f8000003f800000;
      auVar323._12_4_ = 0x3f800000;
      auVar113 = vsubps_avx(auVar323,auVar142);
      local_468._0_4_ = auVar156._0_4_;
      local_468._4_4_ = auVar156._4_4_;
      fStack_460 = auVar156._8_4_;
      fStack_45c = auVar156._12_4_;
      fVar215 = auVar142._0_4_;
      fVar165 = auVar142._4_4_;
      fVar216 = auVar142._8_4_;
      fVar166 = auVar142._12_4_;
      local_4f8._0_4_ = auVar124._0_4_;
      local_4f8._4_4_ = auVar124._4_4_;
      fStack_4f0 = auVar124._8_4_;
      fStack_4ec = auVar124._12_4_;
      fVar217 = auVar113._0_4_;
      fVar167 = auVar113._4_4_;
      fVar218 = auVar113._8_4_;
      fVar168 = auVar113._12_4_;
      auVar86._0_4_ = fVar215 * (float)local_468._0_4_ + fVar217 * auVar228._0_4_;
      auVar86._4_4_ = fVar165 * (float)local_468._4_4_ + fVar167 * auVar228._4_4_;
      auVar86._8_4_ = fVar216 * fStack_460 + fVar218 * auVar228._0_4_;
      auVar86._12_4_ = fVar166 * fStack_45c + fVar168 * auVar228._4_4_;
      auVar208._0_4_ = auVar112._0_4_ * fVar215 + fVar217 * auVar187._0_4_;
      auVar208._4_4_ = auVar112._4_4_ * fVar165 + fVar167 * auVar187._4_4_;
      auVar208._8_4_ = auVar112._8_4_ * fVar216 + fVar218 * auVar187._0_4_;
      auVar208._12_4_ = auVar112._12_4_ * fVar166 + fVar168 * auVar187._4_4_;
      auVar244._0_4_ = auVar255._0_4_ * fVar215 + fVar217 * fVar219;
      auVar244._4_4_ = auVar255._4_4_ * fVar165 + fVar167 * fVar169;
      auVar244._8_4_ = auVar255._8_4_ * fVar216 + fVar218 * fVar219;
      auVar244._12_4_ = auVar255._12_4_ * fVar166 + fVar168 * fVar169;
      auVar287._0_4_ = fVar215 * (float)local_4f8._0_4_ + fVar217 * auVar230._16_4_;
      auVar287._4_4_ = fVar165 * (float)local_4f8._4_4_ + fVar167 * auVar230._20_4_;
      auVar287._8_4_ = fVar216 * fStack_4f0 + fVar218 * auVar230._16_4_;
      auVar287._12_4_ = fVar166 * fStack_4ec + fVar168 * auVar230._20_4_;
      auVar124 = vsubps_avx(auVar323,auVar83);
      auVar255 = vmovshdup_avx(auVar317);
      auVar156 = vmovsldup_avx(auVar317);
      auVar330._0_4_ = auVar124._0_4_ * auVar156._0_4_ + auVar83._0_4_ * auVar255._0_4_;
      auVar330._4_4_ = auVar124._4_4_ * auVar156._4_4_ + auVar83._4_4_ * auVar255._4_4_;
      auVar330._8_4_ = auVar124._8_4_ * auVar156._8_4_ + auVar83._8_4_ * auVar255._8_4_;
      auVar330._12_4_ = auVar124._12_4_ * auVar156._12_4_ + auVar83._12_4_ * auVar255._12_4_;
      auVar6 = vmovshdup_avx(auVar330);
      auVar83 = vsubps_avx(auVar208,auVar86);
      auVar145._0_4_ = auVar83._0_4_ * 3.0;
      auVar145._4_4_ = auVar83._4_4_ * 3.0;
      auVar145._8_4_ = auVar83._8_4_ * 3.0;
      auVar145._12_4_ = auVar83._12_4_ * 3.0;
      auVar83 = vsubps_avx(auVar244,auVar208);
      auVar173._0_4_ = auVar83._0_4_ * 3.0;
      auVar173._4_4_ = auVar83._4_4_ * 3.0;
      auVar173._8_4_ = auVar83._8_4_ * 3.0;
      auVar173._12_4_ = auVar83._12_4_ * 3.0;
      auVar83 = vsubps_avx(auVar287,auVar244);
      auVar259._0_4_ = auVar83._0_4_ * 3.0;
      auVar259._4_4_ = auVar83._4_4_ * 3.0;
      auVar259._8_4_ = auVar83._8_4_ * 3.0;
      auVar259._12_4_ = auVar83._12_4_ * 3.0;
      auVar255 = vminps_avx(auVar173,auVar259);
      auVar83 = vmaxps_avx(auVar173,auVar259);
      auVar255 = vminps_avx(auVar145,auVar255);
      auVar83 = vmaxps_avx(auVar145,auVar83);
      auVar156 = vshufpd_avx(auVar255,auVar255,3);
      auVar124 = vshufpd_avx(auVar83,auVar83,3);
      auVar255 = vminps_avx(auVar255,auVar156);
      auVar83 = vmaxps_avx(auVar83,auVar124);
      auVar156 = vshufps_avx(ZEXT416((uint)(1.0 / fVar201)),ZEXT416((uint)(1.0 / fVar201)),0);
      auVar260._0_4_ = auVar156._0_4_ * auVar255._0_4_;
      auVar260._4_4_ = auVar156._4_4_ * auVar255._4_4_;
      auVar260._8_4_ = auVar156._8_4_ * auVar255._8_4_;
      auVar260._12_4_ = auVar156._12_4_ * auVar255._12_4_;
      auVar270._0_4_ = auVar156._0_4_ * auVar83._0_4_;
      auVar270._4_4_ = auVar156._4_4_ * auVar83._4_4_;
      auVar270._8_4_ = auVar156._8_4_ * auVar83._8_4_;
      auVar270._12_4_ = auVar156._12_4_ * auVar83._12_4_;
      auVar113 = ZEXT416((uint)(1.0 / (auVar6._0_4_ - auVar330._0_4_)));
      auVar83 = vshufpd_avx(auVar86,auVar86,3);
      auVar255 = vshufpd_avx(auVar208,auVar208,3);
      auVar156 = vshufpd_avx(auVar244,auVar244,3);
      auVar124 = vshufpd_avx(auVar287,auVar287,3);
      auVar83 = vsubps_avx(auVar83,auVar86);
      auVar112 = vsubps_avx(auVar255,auVar208);
      auVar142 = vsubps_avx(auVar156,auVar244);
      auVar124 = vsubps_avx(auVar124,auVar287);
      auVar255 = vminps_avx(auVar83,auVar112);
      auVar83 = vmaxps_avx(auVar83,auVar112);
      auVar156 = vminps_avx(auVar142,auVar124);
      auVar156 = vminps_avx(auVar255,auVar156);
      auVar255 = vmaxps_avx(auVar142,auVar124);
      auVar83 = vmaxps_avx(auVar83,auVar255);
      auVar255 = vshufps_avx(auVar113,auVar113,0);
      auVar318._0_4_ = auVar255._0_4_ * auVar156._0_4_;
      auVar318._4_4_ = auVar255._4_4_ * auVar156._4_4_;
      auVar318._8_4_ = auVar255._8_4_ * auVar156._8_4_;
      auVar318._12_4_ = auVar255._12_4_ * auVar156._12_4_;
      auVar324._0_4_ = auVar255._0_4_ * auVar83._0_4_;
      auVar324._4_4_ = auVar255._4_4_ * auVar83._4_4_;
      auVar324._8_4_ = auVar255._8_4_ * auVar83._8_4_;
      auVar324._12_4_ = auVar255._12_4_ * auVar83._12_4_;
      auVar83 = vmovsldup_avx(auVar330);
      auVar288._4_12_ = auVar83._4_12_;
      auVar288._0_4_ = fVar164;
      auVar297._4_12_ = auVar330._4_12_;
      auVar297._0_4_ = fVar137;
      auVar174._0_4_ = (fVar164 + fVar137) * 0.5;
      auVar174._4_4_ = (auVar83._4_4_ + auVar330._4_4_) * 0.5;
      auVar174._8_4_ = (auVar83._8_4_ + auVar330._8_4_) * 0.5;
      auVar174._12_4_ = (auVar83._12_4_ + auVar330._12_4_) * 0.5;
      auVar83 = vshufps_avx(auVar174,auVar174,0);
      fVar215 = auVar83._0_4_;
      fVar165 = auVar83._4_4_;
      fVar216 = auVar83._8_4_;
      fVar166 = auVar83._12_4_;
      auVar114._0_4_ = fVar215 * (float)local_1e8._0_4_ + (float)local_328._0_4_;
      auVar114._4_4_ = fVar165 * (float)local_1e8._4_4_ + (float)local_328._4_4_;
      auVar114._8_4_ = fVar216 * fStack_1e0 + fStack_320;
      auVar114._12_4_ = fVar166 * fStack_1dc + fStack_31c;
      auVar146._0_4_ = fVar215 * (float)local_1f8._0_4_ + (float)local_338._0_4_;
      auVar146._4_4_ = fVar165 * (float)local_1f8._4_4_ + (float)local_338._4_4_;
      auVar146._8_4_ = fVar216 * fStack_1f0 + fStack_330;
      auVar146._12_4_ = fVar166 * fStack_1ec + fStack_32c;
      auVar209._0_4_ = fVar215 * (float)local_208._0_4_ + (float)local_348._0_4_;
      auVar209._4_4_ = fVar165 * (float)local_208._4_4_ + (float)local_348._4_4_;
      auVar209._8_4_ = fVar216 * fStack_200 + fStack_340;
      auVar209._12_4_ = fVar166 * fStack_1fc + fStack_33c;
      auVar83 = vsubps_avx(auVar146,auVar114);
      auVar115._0_4_ = auVar114._0_4_ + fVar215 * auVar83._0_4_;
      auVar115._4_4_ = auVar114._4_4_ + fVar165 * auVar83._4_4_;
      auVar115._8_4_ = auVar114._8_4_ + fVar216 * auVar83._8_4_;
      auVar115._12_4_ = auVar114._12_4_ + fVar166 * auVar83._12_4_;
      auVar83 = vsubps_avx(auVar209,auVar146);
      auVar147._0_4_ = auVar146._0_4_ + fVar215 * auVar83._0_4_;
      auVar147._4_4_ = auVar146._4_4_ + fVar165 * auVar83._4_4_;
      auVar147._8_4_ = auVar146._8_4_ + fVar216 * auVar83._8_4_;
      auVar147._12_4_ = auVar146._12_4_ + fVar166 * auVar83._12_4_;
      auVar83 = vsubps_avx(auVar147,auVar115);
      fVar215 = auVar115._0_4_ + fVar215 * auVar83._0_4_;
      fVar165 = auVar115._4_4_ + fVar165 * auVar83._4_4_;
      auVar87._0_8_ = CONCAT44(fVar165,fVar215);
      auVar87._8_4_ = auVar115._8_4_ + fVar216 * auVar83._8_4_;
      auVar87._12_4_ = auVar115._12_4_ + fVar166 * auVar83._12_4_;
      fVar216 = auVar83._0_4_ * 3.0;
      fVar166 = auVar83._4_4_ * 3.0;
      auVar116._0_8_ = CONCAT44(fVar166,fVar216);
      auVar116._8_4_ = auVar83._8_4_ * 3.0;
      auVar116._12_4_ = auVar83._12_4_ * 3.0;
      auVar148._8_8_ = auVar87._0_8_;
      auVar148._0_8_ = auVar87._0_8_;
      auVar83 = vshufpd_avx(auVar87,auVar87,3);
      auVar255 = vshufps_avx(auVar174,auVar174,0x55);
      auVar142 = vsubps_avx(auVar83,auVar148);
      auVar306._0_4_ = auVar142._0_4_ * auVar255._0_4_ + fVar215;
      auVar306._4_4_ = auVar142._4_4_ * auVar255._4_4_ + fVar165;
      auVar306._8_4_ = auVar142._8_4_ * auVar255._8_4_ + fVar215;
      auVar306._12_4_ = auVar142._12_4_ * auVar255._12_4_ + fVar165;
      auVar149._8_8_ = auVar116._0_8_;
      auVar149._0_8_ = auVar116._0_8_;
      auVar83 = vshufpd_avx(auVar116,auVar116,1);
      auVar83 = vsubps_avx(auVar83,auVar149);
      auVar117._0_4_ = auVar83._0_4_ * auVar255._0_4_ + fVar216;
      auVar117._4_4_ = auVar83._4_4_ * auVar255._4_4_ + fVar166;
      auVar117._8_4_ = auVar83._8_4_ * auVar255._8_4_ + fVar216;
      auVar117._12_4_ = auVar83._12_4_ * auVar255._12_4_ + fVar166;
      auVar255 = vmovshdup_avx(auVar117);
      auVar210._0_8_ = auVar255._0_8_ ^ 0x8000000080000000;
      auVar210._8_4_ = auVar255._8_4_ ^ 0x80000000;
      auVar210._12_4_ = auVar255._12_4_ ^ 0x80000000;
      auVar156 = vmovshdup_avx(auVar142);
      auVar83 = vunpcklps_avx(auVar156,auVar210);
      auVar124 = vshufps_avx(auVar83,auVar210,4);
      auVar88._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
      auVar88._8_4_ = -auVar142._8_4_;
      auVar88._12_4_ = -auVar142._12_4_;
      auVar83 = vmovlhps_avx(auVar88,auVar117);
      auVar112 = vshufps_avx(auVar83,auVar117,8);
      auVar83 = ZEXT416((uint)(auVar117._0_4_ * auVar156._0_4_ - auVar142._0_4_ * auVar255._0_4_));
      auVar255 = vshufps_avx(auVar83,auVar83,0);
      auVar83 = vdivps_avx(auVar124,auVar255);
      auVar255 = vdivps_avx(auVar112,auVar255);
      auVar112 = vinsertps_avx(auVar260,auVar318,0x1c);
      auVar142 = vinsertps_avx(auVar270,auVar324,0x1c);
      auVar113 = vinsertps_avx(auVar318,auVar260,0x4c);
      auVar236 = vinsertps_avx(auVar324,auVar270,0x4c);
      auVar156 = vmovsldup_avx(auVar83);
      auVar150._0_4_ = auVar156._0_4_ * auVar112._0_4_;
      auVar150._4_4_ = auVar156._4_4_ * auVar112._4_4_;
      auVar150._8_4_ = auVar156._8_4_ * auVar112._8_4_;
      auVar150._12_4_ = auVar156._12_4_ * auVar112._12_4_;
      auVar118._0_4_ = auVar142._0_4_ * auVar156._0_4_;
      auVar118._4_4_ = auVar142._4_4_ * auVar156._4_4_;
      auVar118._8_4_ = auVar142._8_4_ * auVar156._8_4_;
      auVar118._12_4_ = auVar142._12_4_ * auVar156._12_4_;
      auVar124 = vminps_avx(auVar150,auVar118);
      auVar156 = vmaxps_avx(auVar118,auVar150);
      auVar5 = vmovsldup_avx(auVar255);
      auVar325._0_4_ = auVar113._0_4_ * auVar5._0_4_;
      auVar325._4_4_ = auVar113._4_4_ * auVar5._4_4_;
      auVar325._8_4_ = auVar113._8_4_ * auVar5._8_4_;
      auVar325._12_4_ = auVar113._12_4_ * auVar5._12_4_;
      auVar151._0_4_ = auVar236._0_4_ * auVar5._0_4_;
      auVar151._4_4_ = auVar236._4_4_ * auVar5._4_4_;
      auVar151._8_4_ = auVar236._8_4_ * auVar5._8_4_;
      auVar151._12_4_ = auVar236._12_4_ * auVar5._12_4_;
      auVar5 = vminps_avx(auVar325,auVar151);
      auVar190._0_4_ = auVar124._0_4_ + auVar5._0_4_;
      auVar190._4_4_ = auVar124._4_4_ + auVar5._4_4_;
      auVar190._8_4_ = auVar124._8_4_ + auVar5._8_4_;
      auVar190._12_4_ = auVar124._12_4_ + auVar5._12_4_;
      auVar124 = vmaxps_avx(auVar151,auVar325);
      auVar5 = vsubps_avx(auVar288,auVar174);
      auVar256 = vsubps_avx(auVar297,auVar174);
      auVar119._0_4_ = auVar156._0_4_ + auVar124._0_4_;
      auVar119._4_4_ = auVar156._4_4_ + auVar124._4_4_;
      auVar119._8_4_ = auVar156._8_4_ + auVar124._8_4_;
      auVar119._12_4_ = auVar156._12_4_ + auVar124._12_4_;
      auVar152._8_8_ = 0x3f800000;
      auVar152._0_8_ = 0x3f800000;
      auVar156 = vsubps_avx(auVar152,auVar119);
      auVar124 = vsubps_avx(auVar152,auVar190);
      fVar218 = auVar5._0_4_;
      auVar191._0_4_ = fVar218 * auVar156._0_4_;
      fVar168 = auVar5._4_4_;
      auVar191._4_4_ = fVar168 * auVar156._4_4_;
      fVar219 = auVar5._8_4_;
      auVar191._8_4_ = fVar219 * auVar156._8_4_;
      fVar169 = auVar5._12_4_;
      auVar191._12_4_ = fVar169 * auVar156._12_4_;
      fVar216 = auVar256._0_4_;
      auVar120._0_4_ = fVar216 * auVar156._0_4_;
      fVar166 = auVar256._4_4_;
      auVar120._4_4_ = fVar166 * auVar156._4_4_;
      fVar217 = auVar256._8_4_;
      auVar120._8_4_ = fVar217 * auVar156._8_4_;
      fVar167 = auVar256._12_4_;
      auVar120._12_4_ = fVar167 * auVar156._12_4_;
      auVar289._0_4_ = fVar218 * auVar124._0_4_;
      auVar289._4_4_ = fVar168 * auVar124._4_4_;
      auVar289._8_4_ = fVar219 * auVar124._8_4_;
      auVar289._12_4_ = fVar169 * auVar124._12_4_;
      auVar153._0_4_ = fVar216 * auVar124._0_4_;
      auVar153._4_4_ = fVar166 * auVar124._4_4_;
      auVar153._8_4_ = fVar217 * auVar124._8_4_;
      auVar153._12_4_ = fVar167 * auVar124._12_4_;
      auVar156 = vminps_avx(auVar191,auVar289);
      auVar124 = vminps_avx(auVar120,auVar153);
      auVar5 = vminps_avx(auVar156,auVar124);
      auVar156 = vmaxps_avx(auVar289,auVar191);
      auVar124 = vmaxps_avx(auVar153,auVar120);
      auVar256 = vshufps_avx(auVar174,auVar174,0x54);
      auVar124 = vmaxps_avx(auVar124,auVar156);
      auVar7 = vshufps_avx(auVar306,auVar306,0);
      auVar75 = vshufps_avx(auVar306,auVar306,0x55);
      auVar156 = vhaddps_avx(auVar5,auVar5);
      auVar124 = vhaddps_avx(auVar124,auVar124);
      auVar175._0_4_ = auVar7._0_4_ * auVar83._0_4_ + auVar75._0_4_ * auVar255._0_4_;
      auVar175._4_4_ = auVar7._4_4_ * auVar83._4_4_ + auVar75._4_4_ * auVar255._4_4_;
      auVar175._8_4_ = auVar7._8_4_ * auVar83._8_4_ + auVar75._8_4_ * auVar255._8_4_;
      auVar175._12_4_ = auVar7._12_4_ * auVar83._12_4_ + auVar75._12_4_ * auVar255._12_4_;
      auVar5 = vsubps_avx(auVar256,auVar175);
      fVar215 = auVar5._0_4_ + auVar156._0_4_;
      fVar165 = auVar5._0_4_ + auVar124._0_4_;
      auVar156 = vmaxss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar215));
      auVar124 = vminss_avx(ZEXT416((uint)fVar165),ZEXT416((uint)fVar137));
    } while (auVar124._0_4_ < auVar156._0_4_);
    auVar156 = vmovshdup_avx(auVar83);
    auVar89._0_4_ = auVar156._0_4_ * auVar112._0_4_;
    auVar89._4_4_ = auVar156._4_4_ * auVar112._4_4_;
    auVar89._8_4_ = auVar156._8_4_ * auVar112._8_4_;
    auVar89._12_4_ = auVar156._12_4_ * auVar112._12_4_;
    auVar121._0_4_ = auVar142._0_4_ * auVar156._0_4_;
    auVar121._4_4_ = auVar142._4_4_ * auVar156._4_4_;
    auVar121._8_4_ = auVar142._8_4_ * auVar156._8_4_;
    auVar121._12_4_ = auVar142._12_4_ * auVar156._12_4_;
    auVar124 = vminps_avx(auVar89,auVar121);
    auVar156 = vmaxps_avx(auVar121,auVar89);
    auVar112 = vmovshdup_avx(auVar255);
    auVar192._0_4_ = auVar113._0_4_ * auVar112._0_4_;
    auVar192._4_4_ = auVar113._4_4_ * auVar112._4_4_;
    auVar192._8_4_ = auVar113._8_4_ * auVar112._8_4_;
    auVar192._12_4_ = auVar113._12_4_ * auVar112._12_4_;
    auVar122._0_4_ = auVar236._0_4_ * auVar112._0_4_;
    auVar122._4_4_ = auVar236._4_4_ * auVar112._4_4_;
    auVar122._8_4_ = auVar236._8_4_ * auVar112._8_4_;
    auVar122._12_4_ = auVar236._12_4_ * auVar112._12_4_;
    auVar112 = vminps_avx(auVar192,auVar122);
    auVar154._0_4_ = auVar124._0_4_ + auVar112._0_4_;
    auVar154._4_4_ = auVar124._4_4_ + auVar112._4_4_;
    auVar154._8_4_ = auVar124._8_4_ + auVar112._8_4_;
    auVar154._12_4_ = auVar124._12_4_ + auVar112._12_4_;
    auVar124 = vmaxps_avx(auVar122,auVar192);
    auVar90._0_4_ = auVar156._0_4_ + auVar124._0_4_;
    auVar90._4_4_ = auVar156._4_4_ + auVar124._4_4_;
    auVar90._8_4_ = auVar156._8_4_ + auVar124._8_4_;
    auVar90._12_4_ = auVar156._12_4_ + auVar124._12_4_;
    auVar156 = vsubps_avx(local_368._0_16_,auVar90);
    auVar124 = vsubps_avx(local_368._0_16_,auVar154);
    auVar155._0_4_ = fVar218 * auVar156._0_4_;
    auVar155._4_4_ = fVar168 * auVar156._4_4_;
    auVar155._8_4_ = fVar219 * auVar156._8_4_;
    auVar155._12_4_ = fVar169 * auVar156._12_4_;
    auVar193._0_4_ = fVar218 * auVar124._0_4_;
    auVar193._4_4_ = fVar168 * auVar124._4_4_;
    auVar193._8_4_ = fVar219 * auVar124._8_4_;
    auVar193._12_4_ = fVar169 * auVar124._12_4_;
    auVar91._0_4_ = fVar216 * auVar156._0_4_;
    auVar91._4_4_ = fVar166 * auVar156._4_4_;
    auVar91._8_4_ = fVar217 * auVar156._8_4_;
    auVar91._12_4_ = fVar167 * auVar156._12_4_;
    auVar123._0_4_ = fVar216 * auVar124._0_4_;
    auVar123._4_4_ = fVar166 * auVar124._4_4_;
    auVar123._8_4_ = fVar217 * auVar124._8_4_;
    auVar123._12_4_ = fVar167 * auVar124._12_4_;
    auVar156 = vminps_avx(auVar155,auVar193);
    auVar124 = vminps_avx(auVar91,auVar123);
    auVar156 = vminps_avx(auVar156,auVar124);
    auVar124 = vmaxps_avx(auVar193,auVar155);
    auVar112 = vmaxps_avx(auVar123,auVar91);
    auVar156 = vhaddps_avx(auVar156,auVar156);
    auVar124 = vmaxps_avx(auVar112,auVar124);
    auVar124 = vhaddps_avx(auVar124,auVar124);
    auVar112 = vmovshdup_avx(auVar5);
    auVar142 = ZEXT416((uint)(auVar112._0_4_ + auVar156._0_4_));
    auVar156 = vmaxss_avx(auVar330,auVar142);
    auVar112 = ZEXT416((uint)(auVar112._0_4_ + auVar124._0_4_));
    auVar124 = vminss_avx(auVar112,auVar6);
  } while (auVar124._0_4_ < auVar156._0_4_);
  uVar66 = 0;
  if ((fVar164 < fVar215) && (fVar165 < fVar137)) {
    auVar156 = vcmpps_avx(auVar112,auVar6,1);
    auVar124 = vcmpps_avx(auVar330,auVar142,1);
    auVar156 = vandps_avx(auVar124,auVar156);
    uVar66 = auVar156._0_4_;
  }
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  if (((uint)uVar72 < 4 && 0.001 <= fVar201) && (uVar66 & 1) == 0) goto LAB_009c5866;
  lVar68 = 0xc9;
  do {
    lVar68 = lVar68 + -1;
    if (lVar68 == 0) goto LAB_009c4984;
    fVar201 = auVar5._0_4_;
    fVar137 = 1.0 - fVar201;
    auVar156 = ZEXT416((uint)(fVar137 * fVar137 * fVar137));
    auVar156 = vshufps_avx(auVar156,auVar156,0);
    auVar124 = ZEXT416((uint)(fVar201 * 3.0 * fVar137 * fVar137));
    auVar124 = vshufps_avx(auVar124,auVar124,0);
    auVar112 = ZEXT416((uint)(fVar137 * fVar201 * fVar201 * 3.0));
    auVar112 = vshufps_avx(auVar112,auVar112,0);
    auVar142 = ZEXT416((uint)(fVar201 * fVar201 * fVar201));
    auVar142 = vshufps_avx(auVar142,auVar142,0);
    fVar137 = (float)local_328._0_4_ * auVar156._0_4_ +
              (float)local_338._0_4_ * auVar124._0_4_ +
              (float)local_218._0_4_ * auVar142._0_4_ + (float)local_348._0_4_ * auVar112._0_4_;
    fVar201 = (float)local_328._4_4_ * auVar156._4_4_ +
              (float)local_338._4_4_ * auVar124._4_4_ +
              (float)local_218._4_4_ * auVar142._4_4_ + (float)local_348._4_4_ * auVar112._4_4_;
    auVar92._0_8_ = CONCAT44(fVar201,fVar137);
    auVar92._8_4_ =
         fStack_320 * auVar156._8_4_ +
         fStack_330 * auVar124._8_4_ + fStack_210 * auVar142._8_4_ + fStack_340 * auVar112._8_4_;
    auVar92._12_4_ =
         fStack_31c * auVar156._12_4_ +
         fStack_32c * auVar124._12_4_ + fStack_20c * auVar142._12_4_ + fStack_33c * auVar112._12_4_;
    auVar125._8_8_ = auVar92._0_8_;
    auVar125._0_8_ = auVar92._0_8_;
    auVar124 = vshufpd_avx(auVar92,auVar92,1);
    auVar156 = vmovshdup_avx(auVar5);
    auVar124 = vsubps_avx(auVar124,auVar125);
    auVar93._0_4_ = auVar156._0_4_ * auVar124._0_4_ + fVar137;
    auVar93._4_4_ = auVar156._4_4_ * auVar124._4_4_ + fVar201;
    auVar93._8_4_ = auVar156._8_4_ * auVar124._8_4_ + fVar137;
    auVar93._12_4_ = auVar156._12_4_ * auVar124._12_4_ + fVar201;
    auVar156 = vshufps_avx(auVar93,auVar93,0);
    auVar124 = vshufps_avx(auVar93,auVar93,0x55);
    auVar126._0_4_ = auVar83._0_4_ * auVar156._0_4_ + auVar255._0_4_ * auVar124._0_4_;
    auVar126._4_4_ = auVar83._4_4_ * auVar156._4_4_ + auVar255._4_4_ * auVar124._4_4_;
    auVar126._8_4_ = auVar83._8_4_ * auVar156._8_4_ + auVar255._8_4_ * auVar124._8_4_;
    auVar126._12_4_ = auVar83._12_4_ * auVar156._12_4_ + auVar255._12_4_ * auVar124._12_4_;
    auVar5 = vsubps_avx(auVar5,auVar126);
    auVar156 = vandps_avx(auVar261,auVar93);
    auVar124 = vshufps_avx(auVar156,auVar156,0xf5);
    auVar156 = vmaxss_avx(auVar124,auVar156);
  } while ((float)local_228._0_4_ <= auVar156._0_4_);
  fVar137 = auVar5._0_4_;
  if ((fVar137 < 0.0) || (1.0 < fVar137)) goto LAB_009c4984;
  auVar83 = vmovshdup_avx(auVar5);
  fVar201 = auVar83._0_4_;
  if ((fVar201 < 0.0) || (1.0 < fVar201)) goto LAB_009c4984;
  auVar83 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar236 = vinsertps_avx(auVar83,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar4 = (ray->org).field_0;
  auVar83 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
  auVar83 = vdpps_avx(auVar83,auVar236,0x7f);
  auVar255 = vsubps_avx(_local_428,(undefined1  [16])aVar4);
  auVar255 = vdpps_avx(auVar255,auVar236,0x7f);
  auVar156 = vsubps_avx(_local_438,(undefined1  [16])aVar4);
  auVar156 = vdpps_avx(auVar156,auVar236,0x7f);
  auVar124 = vsubps_avx(_local_418,(undefined1  [16])aVar4);
  auVar124 = vdpps_avx(auVar124,auVar236,0x7f);
  auVar112 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
  auVar112 = vdpps_avx(auVar112,auVar236,0x7f);
  auVar142 = vsubps_avx(_local_448,(undefined1  [16])aVar4);
  auVar142 = vdpps_avx(auVar142,auVar236,0x7f);
  auVar113 = vsubps_avx(_local_2d8,(undefined1  [16])aVar4);
  auVar113 = vdpps_avx(auVar113,auVar236,0x7f);
  auVar64._4_4_ = fStack_474;
  auVar64._0_4_ = local_478;
  auVar64._8_4_ = fStack_470;
  auVar64._12_4_ = fStack_46c;
  auVar6 = vsubps_avx(auVar64,(undefined1  [16])aVar4);
  auVar236 = vdpps_avx(auVar6,auVar236,0x7f);
  fVar166 = 1.0 - fVar201;
  fVar217 = 1.0 - fVar137;
  fVar164 = auVar5._4_4_;
  fVar215 = auVar5._8_4_;
  fVar165 = auVar5._12_4_;
  fVar216 = fVar217 * fVar137 * fVar137 * 3.0;
  auVar211._0_4_ = fVar137 * fVar137 * fVar137;
  auVar211._4_4_ = fVar164 * fVar164 * fVar164;
  auVar211._8_4_ = fVar215 * fVar215 * fVar215;
  auVar211._12_4_ = fVar165 * fVar165 * fVar165;
  fVar164 = fVar137 * 3.0 * fVar217 * fVar217;
  fVar215 = fVar217 * fVar217 * fVar217;
  fVar137 = (fVar166 * auVar83._0_4_ + auVar112._0_4_ * fVar201) * fVar215 +
            fVar164 * (auVar142._0_4_ * fVar201 + fVar166 * auVar255._0_4_) +
            fVar216 * (auVar113._0_4_ * fVar201 + fVar166 * auVar156._0_4_) +
            auVar211._0_4_ * (fVar166 * auVar124._0_4_ + fVar201 * auVar236._0_4_);
  if ((fVar137 < (ray->org).field_0.m128[3]) || (fVar201 = ray->tfar, fVar201 < fVar137))
  goto LAB_009c4984;
  pGVar9 = (context->scene->geometries).items[local_480].ptr;
  if ((pGVar9->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar65 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_009c584d;
    auVar83 = vshufps_avx(auVar5,auVar5,0x55);
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar255 = vsubps_avx(auVar262,auVar83);
    fVar165 = auVar83._0_4_;
    fVar166 = auVar83._4_4_;
    fVar167 = auVar83._8_4_;
    fVar218 = auVar83._12_4_;
    fVar168 = auVar255._0_4_;
    fVar219 = auVar255._4_4_;
    fVar169 = auVar255._8_4_;
    fVar220 = auVar255._12_4_;
    auVar271._0_4_ = fVar165 * (float)local_408._0_4_ + fVar168 * (float)local_3f8._0_4_;
    auVar271._4_4_ = fVar166 * (float)local_408._4_4_ + fVar219 * (float)local_3f8._4_4_;
    auVar271._8_4_ = fVar167 * fStack_400 + fVar169 * fStack_3f0;
    auVar271._12_4_ = fVar218 * fStack_3fc + fVar220 * fStack_3ec;
    auVar290._0_4_ = fVar165 * (float)local_448._0_4_ + fVar168 * (float)local_428._0_4_;
    auVar290._4_4_ = fVar166 * (float)local_448._4_4_ + fVar219 * (float)local_428._4_4_;
    auVar290._8_4_ = fVar167 * fStack_440 + fVar169 * fStack_420;
    auVar290._12_4_ = fVar218 * fStack_43c + fVar220 * fStack_41c;
    auVar298._0_4_ = fVar165 * (float)local_2d8._0_4_ + fVar168 * (float)local_438._0_4_;
    auVar298._4_4_ = fVar166 * (float)local_2d8._4_4_ + fVar219 * (float)local_438._4_4_;
    auVar298._8_4_ = fVar167 * fStack_2d0 + fVar169 * fStack_430;
    auVar298._12_4_ = fVar218 * fStack_2cc + fVar220 * fStack_42c;
    auVar245._0_4_ = fVar168 * (float)local_418._0_4_ + fVar165 * local_478;
    auVar245._4_4_ = fVar219 * (float)local_418._4_4_ + fVar166 * fStack_474;
    auVar245._8_4_ = fVar169 * fStack_410 + fVar167 * fStack_470;
    auVar245._12_4_ = fVar220 * fStack_40c + fVar218 * fStack_46c;
    auVar124 = vsubps_avx(auVar290,auVar271);
    auVar112 = vsubps_avx(auVar298,auVar290);
    auVar142 = vsubps_avx(auVar245,auVar298);
    auVar83 = vshufps_avx(auVar5,auVar5,0);
    fVar218 = auVar83._0_4_;
    fVar168 = auVar83._4_4_;
    fVar219 = auVar83._8_4_;
    fVar169 = auVar83._12_4_;
    auVar83 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
    fVar165 = auVar83._0_4_;
    fVar166 = auVar83._4_4_;
    fVar217 = auVar83._8_4_;
    fVar167 = auVar83._12_4_;
    auVar83 = vshufps_avx(auVar211,auVar211,0);
    auVar255 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
    auVar156 = vshufps_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),0);
    auVar194._0_4_ =
         ((auVar124._0_4_ * fVar165 + fVar218 * auVar112._0_4_) * fVar165 +
         fVar218 * (auVar112._0_4_ * fVar165 + fVar218 * auVar142._0_4_)) * 3.0;
    auVar194._4_4_ =
         ((auVar124._4_4_ * fVar166 + fVar168 * auVar112._4_4_) * fVar166 +
         fVar168 * (auVar112._4_4_ * fVar166 + fVar168 * auVar142._4_4_)) * 3.0;
    auVar194._8_4_ =
         ((auVar124._8_4_ * fVar217 + fVar219 * auVar112._8_4_) * fVar217 +
         fVar219 * (auVar112._8_4_ * fVar217 + fVar219 * auVar142._8_4_)) * 3.0;
    auVar194._12_4_ =
         ((auVar124._12_4_ * fVar167 + fVar169 * auVar112._12_4_) * fVar167 +
         fVar169 * (auVar112._12_4_ * fVar167 + fVar169 * auVar142._12_4_)) * 3.0;
    auVar124 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
    auVar127._0_4_ =
         auVar124._0_4_ * (float)local_258._0_4_ +
         auVar156._0_4_ * (float)local_268._0_4_ +
         auVar83._0_4_ * (float)local_288._0_4_ + auVar255._0_4_ * (float)local_278._0_4_;
    auVar127._4_4_ =
         auVar124._4_4_ * (float)local_258._4_4_ +
         auVar156._4_4_ * (float)local_268._4_4_ +
         auVar83._4_4_ * (float)local_288._4_4_ + auVar255._4_4_ * (float)local_278._4_4_;
    auVar127._8_4_ =
         auVar124._8_4_ * fStack_250 +
         auVar156._8_4_ * fStack_260 + auVar83._8_4_ * fStack_280 + auVar255._8_4_ * fStack_270;
    auVar127._12_4_ =
         auVar124._12_4_ * fStack_24c +
         auVar156._12_4_ * fStack_25c + auVar83._12_4_ * fStack_27c + auVar255._12_4_ * fStack_26c;
    auVar83 = vshufps_avx(auVar194,auVar194,0xc9);
    auVar157._0_4_ = auVar127._0_4_ * auVar83._0_4_;
    auVar157._4_4_ = auVar127._4_4_ * auVar83._4_4_;
    auVar157._8_4_ = auVar127._8_4_ * auVar83._8_4_;
    auVar157._12_4_ = auVar127._12_4_ * auVar83._12_4_;
    auVar83 = vshufps_avx(auVar127,auVar127,0xc9);
    auVar128._0_4_ = auVar194._0_4_ * auVar83._0_4_;
    auVar128._4_4_ = auVar194._4_4_ * auVar83._4_4_;
    auVar128._8_4_ = auVar194._8_4_ * auVar83._8_4_;
    auVar128._12_4_ = auVar194._12_4_ * auVar83._12_4_;
    auVar255 = vsubps_avx(auVar128,auVar157);
    auVar83 = vshufps_avx(auVar255,auVar255,0xe9);
    local_2b8 = vmovlps_avx(auVar83);
    local_2b0 = auVar255._0_4_;
    local_2ac = vmovlps_avx(auVar5);
    local_2a4 = (int)local_318;
    local_2a0 = (int)local_480;
    local_29c = context->user->instID[0];
    local_298 = context->user->instPrimID[0];
    ray->tfar = fVar137;
    local_4cc = -1;
    local_308.valid = &local_4cc;
    local_308.geometryUserPtr = pGVar9->userPtr;
    local_308.context = context->user;
    local_308.hit = (RTCHitN *)&local_2b8;
    local_308.N = 1;
    local_308.ray = (RTCRayN *)ray;
    if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
       ((*pGVar9->occlusionFilterN)(&local_308), *local_308.valid != 0)) {
      p_Var10 = context->args->filter;
      if ((p_Var10 == (RTCFilterFunctionN)0x0) ||
         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
            RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
          ((*p_Var10)(&local_308), *local_308.valid != 0)))) {
        bVar65 = 1;
        goto LAB_009c584d;
      }
    }
    ray->tfar = fVar201;
  }
  bVar65 = 0;
LAB_009c584d:
  bVar74 = (bool)(bVar74 | bVar65);
  auVar98 = _local_248;
  goto LAB_009c4984;
LAB_009c5866:
  _local_4f8 = vinsertps_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar137),0x10);
  auVar231 = ZEXT1664(local_378);
  auVar250 = ZEXT1664(local_388);
  auVar331 = ZEXT1664(local_398);
  auVar264 = ZEXT1664(local_3a8);
  auVar294 = ZEXT1664(local_3b8);
  auVar276 = ZEXT1664(local_3c8);
  auVar302 = ZEXT1664(local_3d8);
  auVar308 = ZEXT1664(local_3e8);
  auVar320 = ZEXT1664(auVar330);
  goto LAB_009c432a;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }